

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationYY.cpp
# Opt level: O0

void test_qclab_qgates_RotationYY<std::complex<double>>(void)

{
  double *pdVar1;
  double *pdVar2;
  __type _Var3;
  double dVar4;
  double dVar5;
  real_type rVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  real_type rVar10;
  QAngle<double> lhs;
  QAngle<double> lhs_00;
  QAngle<double> lhs_01;
  bool bVar11;
  char *pcVar12;
  reference pvVar13;
  complex<double> *pcVar14;
  QAngle<double> *pQVar15;
  char *in_R9;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Da_15;
  undefined4 extraout_XMM0_Da_16;
  undefined4 extraout_XMM0_Da_17;
  undefined4 extraout_XMM0_Da_18;
  undefined4 extraout_XMM0_Da_19;
  undefined4 extraout_XMM0_Da_20;
  undefined4 extraout_XMM0_Da_21;
  undefined4 extraout_XMM0_Da_22;
  undefined4 extraout_XMM0_Da_23;
  undefined4 extraout_XMM0_Da_24;
  undefined4 extraout_XMM0_Da_25;
  undefined4 extraout_XMM0_Da_26;
  undefined4 extraout_XMM0_Da_27;
  undefined4 extraout_XMM0_Da_28;
  undefined4 extraout_XMM0_Da_29;
  undefined4 extraout_XMM0_Da_30;
  undefined4 extraout_XMM0_Da_31;
  undefined4 extraout_XMM0_Da_32;
  undefined4 extraout_XMM0_Da_33;
  undefined4 extraout_XMM0_Da_34;
  undefined4 extraout_XMM0_Da_35;
  undefined4 extraout_XMM0_Da_36;
  undefined4 extraout_XMM0_Da_37;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined4 extraout_XMM0_Db_15;
  undefined4 extraout_XMM0_Db_16;
  undefined4 extraout_XMM0_Db_17;
  undefined4 extraout_XMM0_Db_18;
  undefined4 extraout_XMM0_Db_19;
  undefined4 extraout_XMM0_Db_20;
  undefined4 extraout_XMM0_Db_21;
  undefined4 extraout_XMM0_Db_22;
  undefined4 extraout_XMM0_Db_23;
  undefined4 extraout_XMM0_Db_24;
  undefined4 extraout_XMM0_Db_25;
  undefined4 extraout_XMM0_Db_26;
  undefined4 extraout_XMM0_Db_27;
  undefined4 extraout_XMM0_Db_28;
  undefined4 extraout_XMM0_Db_29;
  undefined4 extraout_XMM0_Db_30;
  undefined4 extraout_XMM0_Db_31;
  undefined4 extraout_XMM0_Db_32;
  undefined4 extraout_XMM0_Db_33;
  undefined4 extraout_XMM0_Db_34;
  undefined4 extraout_XMM0_Db_35;
  undefined4 extraout_XMM0_Db_36;
  undefined4 extraout_XMM0_Db_37;
  QAngle<double> QVar16;
  AssertHelper local_2440;
  Message local_2438;
  undefined1 local_2430 [8];
  AssertionResult gtest_ar_114;
  Message local_2418;
  undefined1 local_2410 [8];
  AssertionResult gtest_ar_113;
  Message local_23f8;
  undefined1 local_23f0 [8];
  AssertionResult gtest_ar_112;
  Message local_23d8;
  undefined1 local_23d0 [8];
  AssertionResult gtest_ar_111;
  Message local_23b8;
  undefined1 local_23b0 [8];
  AssertionResult gtest_ar_110;
  Message local_2398;
  undefined1 local_2390 [8];
  AssertionResult gtest_ar_109;
  RotationYY<std::complex<double>_> R2_4;
  R theta_4;
  R sin_8;
  R cos_8;
  RotationYY<std::complex<double>_> R1_4;
  QRotation<double> rot1_4;
  QAngle<double> angle1_4;
  R theta1_4;
  Message local_22e8;
  undefined1 local_22e0 [8];
  AssertionResult gtest_ar_108;
  Message local_22c8;
  undefined1 local_22c0 [8];
  AssertionResult gtest_ar_107;
  Message local_22a8;
  undefined1 local_22a0 [8];
  AssertionResult gtest_ar_106;
  R theta_3;
  R sin_7;
  R cos_7;
  undefined1 local_2260 [8];
  QAngle<double> angle_3;
  undefined1 local_2228 [8];
  RotationYY<std::complex<double>_> R12_1;
  RotationYY<std::complex<double>_> R2_3;
  QRotation<double> rot2_3;
  QAngle<double> angle2_3;
  R theta2_3;
  RotationYY<std::complex<double>_> R1_3;
  QRotation<double> rot1_3;
  QAngle<double> angle1_3;
  R theta1_3;
  Message local_2158;
  undefined1 local_2150 [8];
  AssertionResult gtest_ar_105;
  Message local_2138;
  undefined1 local_2130 [8];
  AssertionResult gtest_ar_104;
  Message local_2118;
  undefined1 local_2110 [8];
  AssertionResult gtest_ar_103;
  R theta_2;
  R sin_6;
  R cos_6;
  undefined1 local_20d0 [8];
  QAngle<double> angle_2;
  undefined1 local_2098 [8];
  RotationYY<std::complex<double>_> R12;
  RotationYY<std::complex<double>_> R2_2;
  QRotation<double> rot2_2;
  QAngle<double> angle2_2;
  R theta2_2;
  RotationYY<std::complex<double>_> R1_2;
  QRotation<double> rot1_2;
  QAngle<double> angle1_2;
  R theta1_2;
  Message local_1fc8;
  undefined1 local_1fc0 [8];
  AssertionResult gtest_ar_102;
  Message local_1fa8;
  undefined1 local_1fa0 [8];
  AssertionResult gtest_ar_101;
  Message local_1f88;
  undefined1 local_1f80 [8];
  AssertionResult gtest_ar_100;
  Message local_1f68;
  undefined1 local_1f60 [8];
  AssertionResult gtest_ar_99;
  Message local_1f48;
  undefined1 local_1f40 [8];
  AssertionResult gtest_ar_98;
  Message local_1f28;
  undefined1 local_1f20 [8];
  AssertionResult gtest_ar_97;
  R theta_1;
  R sin_5;
  R cos_5;
  undefined1 local_1ee0 [8];
  QAngle<double> angle_1;
  RotationYY<std::complex<double>_> R2_1;
  QRotation<double> rot2_1;
  QAngle<double> angle2_1;
  R theta2_1;
  RotationYY<std::complex<double>_> R1_1;
  QRotation<double> rot1_1;
  QAngle<double> angle1_1;
  R theta1_1;
  Message local_1e28;
  undefined1 local_1e20 [8];
  AssertionResult gtest_ar_96;
  Message local_1e08;
  undefined1 local_1e00 [8];
  AssertionResult gtest_ar_95;
  Message local_1de8;
  undefined1 local_1de0 [8];
  AssertionResult gtest_ar_94;
  Message local_1dc8;
  undefined1 local_1dc0 [8];
  AssertionResult gtest_ar_93;
  Message local_1da8;
  undefined1 local_1da0 [8];
  AssertionResult gtest_ar_92;
  Message local_1d88;
  undefined1 local_1d80 [8];
  AssertionResult gtest_ar_91;
  R theta;
  R sin_4;
  R cos_4;
  undefined1 local_1d48 [8];
  QAngle<double> angle;
  RotationYY<std::complex<double>_> R2;
  QRotation<double> rot2;
  QAngle<double> angle2;
  R theta2;
  RotationYY<std::complex<double>_> R1;
  QRotation<double> rot1;
  QAngle<double> angle1;
  R theta1;
  Message local_1c90;
  undefined1 local_1c88 [8];
  AssertionResult gtest_ar_90;
  Message local_1c70;
  undefined1 local_1c68 [8];
  AssertionResult gtest_ar_89;
  Message local_1c50;
  undefined1 local_1c48 [8];
  AssertionResult gtest_ar_88;
  Message local_1c30;
  int local_1c24;
  undefined1 local_1c20 [8];
  AssertionResult gtest_ar_87;
  Message local_1c08;
  int local_1bfc;
  undefined1 local_1bf8 [8];
  AssertionResult gtest_ar_86;
  vector<int,_std::allocator<int>_> qubits_8;
  AssertHelper local_1bb0;
  Message local_1ba8;
  bool local_1b99;
  undefined1 local_1b98 [8];
  AssertionResult gtest_ar__26;
  AssertHelper local_1b68;
  Message local_1b60;
  bool local_1b51;
  undefined1 local_1b50 [8];
  AssertionResult gtest_ar__25;
  Message local_1b38;
  int local_1b30;
  int local_1b2c;
  undefined1 local_1b28 [8];
  AssertionResult gtest_ar_85;
  RotationYY<std::complex<double>_> Ryy_9;
  R sin_3;
  R cos_3;
  int qubit1_2;
  int qubit0_2;
  Message local_1ad0;
  undefined1 local_1ac8 [8];
  AssertionResult gtest_ar_84;
  Message local_1ab0;
  undefined1 local_1aa8 [8];
  AssertionResult gtest_ar_83;
  Message local_1a90;
  undefined1 local_1a88 [8];
  AssertionResult gtest_ar_82;
  Message local_1a70;
  int local_1a64;
  undefined1 local_1a60 [8];
  AssertionResult gtest_ar_81;
  Message local_1a48;
  int local_1a3c;
  undefined1 local_1a38 [8];
  AssertionResult gtest_ar_80;
  vector<int,_std::allocator<int>_> qubits_7;
  AssertHelper local_19f0;
  Message local_19e8;
  bool local_19d9;
  undefined1 local_19d8 [8];
  AssertionResult gtest_ar__24;
  AssertHelper local_19a8;
  Message local_19a0;
  bool local_1991;
  undefined1 local_1990 [8];
  AssertionResult gtest_ar__23;
  Message local_1978;
  int local_1970;
  int local_196c;
  undefined1 local_1968 [8];
  AssertionResult gtest_ar_79;
  RotationYY<std::complex<double>_> Ryy_8;
  int qubit1_1;
  int qubit0_1;
  Message local_1920;
  undefined1 local_1918 [8];
  AssertionResult gtest_ar_78;
  Message local_1900;
  undefined1 local_18f8 [8];
  AssertionResult gtest_ar_77;
  Message local_18e0;
  undefined1 local_18d8 [8];
  AssertionResult gtest_ar_76;
  Message local_18c0;
  int local_18b4;
  undefined1 local_18b0 [8];
  AssertionResult gtest_ar_75;
  Message local_1898;
  int local_188c;
  undefined1 local_1888 [8];
  AssertionResult gtest_ar_74;
  vector<int,_std::allocator<int>_> qubits_6;
  AssertHelper local_1840;
  Message local_1838;
  bool local_1829;
  undefined1 local_1828 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_17f8;
  Message local_17f0;
  bool local_17e1;
  undefined1 local_17e0 [8];
  AssertionResult gtest_ar__21;
  Message local_17c8;
  int local_17c0;
  int local_17bc;
  undefined1 local_17b8 [8];
  AssertionResult gtest_ar_73;
  RotationYY<std::complex<double>_> Ryy_7;
  QRotation<double> rot_2;
  int qubit1;
  int qubit0;
  Message local_1760;
  undefined1 local_1758 [8];
  AssertionResult gtest_ar_72;
  Message local_1740;
  undefined1 local_1738 [8];
  AssertionResult gtest_ar_71;
  Message local_1720;
  undefined1 local_1718 [8];
  AssertionResult gtest_ar_70;
  Message local_1700;
  int local_16f4;
  undefined1 local_16f0 [8];
  AssertionResult gtest_ar_69;
  Message local_16d8;
  int local_16cc;
  undefined1 local_16c8 [8];
  AssertionResult gtest_ar_68;
  vector<int,_std::allocator<int>_> qubits_5;
  AssertHelper local_1680;
  Message local_1678;
  bool local_1669;
  undefined1 local_1668 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_1638;
  Message local_1630;
  bool local_1621;
  undefined1 local_1620 [8];
  AssertionResult gtest_ar__19;
  Message local_1608;
  int local_1600;
  int local_15fc;
  undefined1 local_15f8 [8];
  AssertionResult gtest_ar_67;
  RotationYY<std::complex<double>_> Ryy_6;
  R sin_2;
  R cos_2;
  int qbits_2 [2];
  Message local_15a0;
  undefined1 local_1598 [8];
  AssertionResult gtest_ar_66;
  Message local_1580;
  undefined1 local_1578 [8];
  AssertionResult gtest_ar_65;
  Message local_1560;
  undefined1 local_1558 [8];
  AssertionResult gtest_ar_64;
  Message local_1540;
  int local_1534;
  undefined1 local_1530 [8];
  AssertionResult gtest_ar_63;
  Message local_1518;
  int local_150c;
  undefined1 local_1508 [8];
  AssertionResult gtest_ar_62;
  vector<int,_std::allocator<int>_> qubits_4;
  AssertHelper local_14c0;
  Message local_14b8;
  bool local_14a9;
  undefined1 local_14a8 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_1478;
  Message local_1470;
  bool local_1461;
  undefined1 local_1460 [8];
  AssertionResult gtest_ar__17;
  Message local_1448;
  int local_1440;
  int local_143c;
  undefined1 local_1438 [8];
  AssertionResult gtest_ar_61;
  RotationYY<std::complex<double>_> Ryy_5;
  int qbits_1 [2];
  Message local_13f0;
  undefined1 local_13e8 [8];
  AssertionResult gtest_ar_60;
  Message local_13d0;
  undefined1 local_13c8 [8];
  AssertionResult gtest_ar_59;
  Message local_13b0;
  undefined1 local_13a8 [8];
  AssertionResult gtest_ar_58;
  Message local_1390;
  int local_1384;
  undefined1 local_1380 [8];
  AssertionResult gtest_ar_57;
  Message local_1368;
  int local_135c;
  undefined1 local_1358 [8];
  AssertionResult gtest_ar_56;
  vector<int,_std::allocator<int>_> qubits_3;
  AssertHelper local_1310;
  Message local_1308;
  bool local_12f9;
  undefined1 local_12f8 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_12c8;
  Message local_12c0;
  bool local_12b1;
  undefined1 local_12b0 [8];
  AssertionResult gtest_ar__15;
  Message local_1298;
  int local_1290;
  int local_128c;
  undefined1 local_1288 [8];
  AssertionResult gtest_ar_55;
  RotationYY<std::complex<double>_> Ryy_4;
  QRotation<double> rot_1;
  int qbits [2];
  Message local_1230;
  undefined1 local_1228 [8];
  AssertionResult gtest_ar_54;
  Message local_1210;
  undefined1 local_1208 [8];
  AssertionResult gtest_ar_53;
  Message local_11f0;
  undefined1 local_11e8 [8];
  AssertionResult gtest_ar_52;
  Message local_11d0;
  int local_11c4;
  undefined1 local_11c0 [8];
  AssertionResult gtest_ar_51;
  Message local_11a8;
  int local_119c;
  undefined1 local_1198 [8];
  AssertionResult gtest_ar_50;
  vector<int,_std::allocator<int>_> qubits_2;
  AssertHelper local_1150;
  Message local_1148;
  bool local_1139;
  undefined1 local_1138 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_1108;
  Message local_1100;
  bool local_10f1;
  undefined1 local_10f0 [8];
  AssertionResult gtest_ar__13;
  Message local_10d8;
  int local_10d0;
  int local_10cc;
  undefined1 local_10c8 [8];
  AssertionResult gtest_ar_49;
  RotationYY<std::complex<double>_> Ryy_3;
  R sin_1;
  R cos_1;
  Message local_1078;
  undefined1 local_1070 [8];
  AssertionResult gtest_ar_48;
  Message local_1058;
  undefined1 local_1050 [8];
  AssertionResult gtest_ar_47;
  Message local_1038;
  undefined1 local_1030 [8];
  AssertionResult gtest_ar_46;
  Message local_1018;
  int local_100c;
  undefined1 local_1008 [8];
  AssertionResult gtest_ar_45;
  Message local_ff0;
  int local_fe4;
  undefined1 local_fe0 [8];
  AssertionResult gtest_ar_44;
  vector<int,_std::allocator<int>_> qubits_1;
  AssertHelper local_f98;
  Message local_f90;
  bool local_f81;
  undefined1 local_f80 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_f50;
  Message local_f48;
  bool local_f39;
  undefined1 local_f38 [8];
  AssertionResult gtest_ar__11;
  Message local_f20;
  int local_f18;
  int local_f14;
  undefined1 local_f10 [8];
  AssertionResult gtest_ar_43;
  RotationYY<std::complex<double>_> Ryy_2;
  Message local_ed0;
  undefined1 local_ec8 [8];
  AssertionResult gtest_ar_42;
  Message local_eb0;
  undefined1 local_ea8 [8];
  AssertionResult gtest_ar_41;
  Message local_e90;
  undefined1 local_e88 [8];
  AssertionResult gtest_ar_40;
  Message local_e70;
  int local_e64;
  undefined1 local_e60 [8];
  AssertionResult gtest_ar_39;
  Message local_e48;
  int local_e3c;
  undefined1 local_e38 [8];
  AssertionResult gtest_ar_38;
  vector<int,_std::allocator<int>_> qubits;
  AssertHelper local_df0;
  Message local_de8;
  bool local_dd9;
  undefined1 local_dd8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_da8;
  Message local_da0;
  bool local_d91;
  undefined1 local_d90 [8];
  AssertionResult gtest_ar__9;
  Message local_d78;
  int local_d70;
  int local_d6c;
  undefined1 local_d68 [8];
  AssertionResult gtest_ar_37;
  RotationYY<std::complex<double>_> Ryy_1;
  QRotation<double> rot;
  AssertHelper local_d00;
  Message local_cf8;
  bool local_ce9;
  undefined1 local_ce8 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_cb8;
  Message local_cb0;
  bool local_ca1;
  undefined1 local_ca0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_c70;
  Message local_c68;
  bool local_c59;
  undefined1 local_c58 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_c28;
  Message local_c20;
  bool local_c11;
  undefined1 local_c10 [8];
  AssertionResult gtest_ar__5;
  RotationYY<std::complex<double>_> Ryy2;
  Message local_bd0;
  undefined1 local_bc8 [8];
  AssertionResult gtest_ar_36;
  Message local_bb0;
  undefined1 local_ba8 [8];
  AssertionResult gtest_ar_35;
  Message local_b90;
  undefined1 local_b88 [8];
  AssertionResult gtest_ar_34;
  AssertHelper local_b58;
  Message local_b50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  undefined1 local_b28 [8];
  AssertionResult gtest_ar_33;
  undefined1 local_af8 [8];
  string qasm_check;
  string str_theta;
  Message local_ab0;
  int local_aa8;
  int local_aa4;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar_32;
  stringstream qasm;
  ostream local_a80 [376];
  AssertHelper local_908;
  Message local_900;
  complex<double> local_8f8;
  undefined1 local_8e8 [16];
  undefined1 local_8d8 [8];
  AssertionResult gtest_ar_31;
  Message local_8c0;
  complex<double> local_8b8;
  undefined1 local_8a8 [16];
  undefined1 local_898 [8];
  AssertionResult gtest_ar_30;
  Message local_880;
  complex<double> local_878;
  undefined1 local_868 [16];
  undefined1 local_858 [8];
  AssertionResult gtest_ar_29;
  Message local_840;
  complex<double> local_838;
  undefined1 local_828 [16];
  undefined1 local_818 [8];
  AssertionResult gtest_ar_28;
  Message local_800;
  complex<double> local_7f8;
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_27;
  Message local_7c0;
  complex<double> local_7b8;
  undefined1 local_7a8 [16];
  undefined1 local_798 [8];
  AssertionResult gtest_ar_26;
  Message local_780;
  complex<double> local_778;
  undefined1 local_768 [16];
  undefined1 local_758 [8];
  AssertionResult gtest_ar_25;
  Message local_740;
  complex<double> local_738;
  undefined1 local_728 [16];
  undefined1 local_718 [8];
  AssertionResult gtest_ar_24;
  Message local_700;
  complex<double> local_6f8;
  undefined1 local_6e8 [16];
  undefined1 local_6d8 [8];
  AssertionResult gtest_ar_23;
  Message local_6c0;
  complex<double> local_6b8;
  undefined1 local_6a8 [16];
  undefined1 local_698 [8];
  AssertionResult gtest_ar_22;
  Message local_680;
  complex<double> local_678;
  undefined1 local_668 [16];
  undefined1 local_658 [8];
  AssertionResult gtest_ar_21;
  Message local_640;
  complex<double> local_638;
  undefined1 local_628 [16];
  undefined1 local_618 [8];
  AssertionResult gtest_ar_20;
  Message local_600;
  complex<double> local_5f8;
  undefined1 local_5e8 [16];
  undefined1 local_5d8 [8];
  AssertionResult gtest_ar_19;
  Message local_5c0;
  complex<double> local_5b8;
  undefined1 local_5a8 [16];
  undefined1 local_598 [8];
  AssertionResult gtest_ar_18;
  Message local_580;
  complex<double> local_578;
  undefined1 local_568 [16];
  undefined1 local_558 [8];
  AssertionResult gtest_ar_17;
  Message local_540;
  complex<double> local_538;
  undefined1 local_528 [16];
  undefined1 local_518 [8];
  AssertionResult gtest_ar_16;
  R sin;
  R cos;
  Message local_4f0;
  undefined1 local_4e8 [8];
  AssertionResult gtest_ar_15;
  Message local_4d0;
  undefined1 local_4c8 [8];
  AssertionResult gtest_ar_14;
  Message local_4b0;
  undefined1 local_4a8 [8];
  AssertionResult gtest_ar_13;
  Message local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_12;
  Message local_470;
  undefined1 local_468 [8];
  AssertionResult gtest_ar_11;
  Message local_450;
  undefined1 local_448 [8];
  AssertionResult gtest_ar_10;
  QRotation<double> new_rot;
  AssertHelper local_408;
  Message local_400;
  bool local_3f1;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__3;
  Message local_390;
  int local_384;
  vector<int,_std::allocator<int>_> local_380;
  undefined1 local_368 [8];
  AssertionResult gtest_ar_9;
  Message local_350;
  int local_344;
  vector<int,_std::allocator<int>_> local_340;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_8;
  Message local_310;
  int local_304;
  vector<int,_std::allocator<int>_> local_300;
  size_type local_2e8;
  undefined1 local_2e0 [8];
  AssertionResult gtest_ar_7;
  int qnew [2];
  Message local_2c0;
  int local_2b4;
  vector<int,_std::allocator<int>_> local_2b0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_6;
  Message local_280;
  int local_274;
  vector<int,_std::allocator<int>_> local_270;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_5;
  Message local_240;
  int local_234;
  vector<int,_std::allocator<int>_> local_230;
  size_type local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_1e0;
  Message local_1d8;
  undefined1 local_1d0 [23];
  bool local_1b9;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__2;
  SquareMatrix<std::complex<double>_> eye;
  Message local_190;
  double local_188;
  real_type local_180;
  undefined1 local_178 [8];
  AssertionResult gtest_ar_3;
  Message local_160;
  double local_158;
  double local_150;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  Message local_130;
  double local_128;
  double local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_e8;
  Message local_e0;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a0;
  Message local_98;
  bool local_89;
  undefined1 local_88 [8];
  AssertionResult gtest_ar_;
  Message local_70;
  int local_68 [5];
  int local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  RotationYY<std::complex<double>_> Ryy;
  R tol;
  R pi;
  
  _Var3 = std::atan<int>(1);
  dVar4 = _Var3 * 4.0;
  dVar5 = std::numeric_limits<double>::epsilon();
  Ryy.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_ = dVar5 * 10.0;
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar.message_);
  local_54 = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                       ((QGate2<std::complex<double>_> *)&gtest_ar.message_);
  local_68[0] = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_50,"Ryy.nbQubits()","2",&local_54,local_68);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar11) {
    testing::Message::Message(&local_70);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xe,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  local_89 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_88,&local_89,(type *)0x0)
  ;
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar11) {
    testing::Message::Message(&local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_88,(AssertionResult *)"Ryy.fixed()"
               ,"true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xf,pcVar12);
    testing::internal::AssertHelper::operator=(&local_a0,&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  local_d1 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar11) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_d0,
               (AssertionResult *)"Ryy.controlled()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x10,pcVar12);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_120 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                        ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,
                         (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  local_128 = 1.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_118,"Ryy.cos()","1.0",&local_120,&local_128);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar11) {
    testing::Message::Message(&local_130);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x11,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_130);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_130);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  local_150 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                        ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,
                         (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  local_158 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_148,"Ryy.sin()","0.0",&local_150,&local_158);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
  if (!bVar11) {
    testing::Message::Message(&local_160);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x12,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_160);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
  local_180 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                        ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  local_188 = 0.0;
  testing::internal::EqHelper::Compare<double,_double,_nullptr>
            ((EqHelper *)local_178,"Ryy.theta()","0.0",&local_180,&local_188);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
  if (!bVar11) {
    testing::Message::Message(&local_190);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_178);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&eye.data_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x13,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&eye.data_,&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&eye.data_);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
  qclab::dense::eye<std::complex<double>>((int64_t)&gtest_ar__2.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_1d0);
  local_1b9 = qclab::dense::SquareMatrix<std::complex<double>_>::operator==
                        ((SquareMatrix<std::complex<double>_> *)local_1d0,
                         (SquareMatrix<std::complex<double>_> *)&gtest_ar__2.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b8,&local_1b9,(type *)0x0);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_1d0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
  if (!bVar11) {
    testing::Message::Message(&local_1d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_4.message_,(internal *)local_1b8,
               (AssertionResult *)"Ryy.matrix() == eye","false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x17,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1e0,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper(&local_1e0);
    std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            (&local_230,(QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  local_218 = std::vector<int,_std::allocator<int>_>::size(&local_230);
  local_234 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_210,"Ryy.qubits().size()","2",&local_218,&local_234);
  std::vector<int,_std::allocator<int>_>::~vector(&local_230);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar11) {
    testing::Message::Message(&local_240);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x1a,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            (&local_270,(QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_270,0);
  local_274 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_258,"Ryy.qubits()[0]","0",pvVar13,&local_274);
  std::vector<int,_std::allocator<int>_>::~vector(&local_270);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
  if (!bVar11) {
    testing::Message::Message(&local_280);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x1b,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_280);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            (&local_2b0,(QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_2b0,1);
  local_2b4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_298,"Ryy.qubits()[1]","1",pvVar13,&local_2b4);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2b0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
  if (!bVar11) {
    testing::Message::Message(&local_2c0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qnew,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x1c,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)qnew,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qnew);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
  gtest_ar_7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x500000003;
  qclab::qgates::QRotationGate2<std::complex<double>_>::setQubits
            ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,(int *)&gtest_ar_7.message_
            );
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            (&local_300,(QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  local_2e8 = std::vector<int,_std::allocator<int>_>::size(&local_300);
  local_304 = 2;
  testing::internal::EqHelper::Compare<unsigned_long,_int,_nullptr>
            ((EqHelper *)local_2e0,"Ryy.qubits().size()","2",&local_2e8,&local_304);
  std::vector<int,_std::allocator<int>_>::~vector(&local_300);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e0);
  if (!bVar11) {
    testing::Message::Message(&local_310);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_2e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x1f,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_310);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e0);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            (&local_340,(QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_340,0);
  local_344 = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_328,"Ryy.qubits()[0]","3",pvVar13,&local_344);
  std::vector<int,_std::allocator<int>_>::~vector(&local_340);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
  if (!bVar11) {
    testing::Message::Message(&local_350);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x20,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_350);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_350);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            (&local_380,(QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_380,1);
  local_384 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_368,"Ryy.qubits()[1]","5",pvVar13,&local_384);
  std::vector<int,_std::allocator<int>_>::~vector(&local_380);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_368);
  if (!bVar11) {
    testing::Message::Message(&local_390);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_368);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x21,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_368);
  qclab::QAdjustable::makeFixed((QAdjustable *)&Ryy);
  local_3a9 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                        ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar11) {
    testing::Message::Message(&local_3b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_3a8,
               (AssertionResult *)"Ryy.fixed()","false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x25,pcVar12);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_3b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  qclab::QAdjustable::makeVariable((QAdjustable *)&Ryy);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  local_3f1 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_3f0,&local_3f1,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar11) {
    testing::Message::Message(&local_400);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&new_rot.angle_.sin_,(internal *)local_3f0,(AssertionResult *)"Ryy.fixed()"
               ,"true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_408,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x27,pcVar12);
    testing::internal::AssertHelper::operator=(&local_408,&local_400);
    testing::internal::AssertHelper::~AssertHelper(&local_408);
    std::__cxx11::string::~string((string *)&new_rot.angle_.sin_);
    testing::Message::~Message(&local_400);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  qclab::QRotation<double>::QRotation((QRotation<double> *)&gtest_ar_10.message_,1.0);
  qclab::qgates::QRotationGate2<std::complex<double>_>::update
            ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,
             (rotation_type *)&gtest_ar_10.message_);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_448,"Ryy.theta()","1","tol",rVar6,1.0,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_448);
  if (!bVar11) {
    testing::Message::Message(&local_450);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_448);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x2c,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_450);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,
                     (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  dVar7 = ::cos(0.5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_468,"Ryy.cos()","std::cos( 0.5 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_468);
  if (!bVar11) {
    testing::Message::Message(&local_470);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_468);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x2d,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_468);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,
                     (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02));
  dVar7 = ::sin(0.5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_488,"Ryy.sin()","std::sin( 0.5 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar11) {
    testing::Message::Message(&local_490);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x2e,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_490);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_490);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  qclab::qgates::QRotationGate2<std::complex<double>_>::update
            ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,dVar4 * 0.5);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4a8,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4a8);
  if (!bVar11) {
    testing::Message::Message(&local_4b0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_4a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x32,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_4b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4a8);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,
                     (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03));
  dVar7 = ::cos(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4c8,"Ryy.cos()","std::cos( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c8);
  if (!bVar11) {
    testing::Message::Message(&local_4d0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_4c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x33,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_4d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_4d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c8);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,
                     (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04));
  dVar7 = ::sin(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_4e8,"Ryy.sin()","std::sin( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e8);
  if (!bVar11) {
    testing::Message::Message(&local_4f0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_4e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x34,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e8);
  dVar5 = ::cos(dVar4 * 0.25);
  gtest_ar_16.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )::sin(dVar4 * 0.25);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_528);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_528,0,0);
  std::complex<double>::complex(&local_538,dVar5,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_518,"Ryy.matrix()(0,0)","T(cos,0.0)",pcVar14,&local_538);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_528);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_518);
  if (!bVar11) {
    testing::Message::Message(&local_540);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_518);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x39,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,&local_540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(&local_540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_518);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_568);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_568,1,1);
  std::complex<double>::complex(&local_578,dVar5,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_558,"Ryy.matrix()(1,1)","T(cos,0.0)",pcVar14,&local_578);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_568);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_558);
  if (!bVar11) {
    testing::Message::Message(&local_580);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x3a,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,&local_580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(&local_580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_558);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_5a8);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_5a8,2,2);
  std::complex<double>::complex(&local_5b8,dVar5,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_598,"Ryy.matrix()(2,2)","T(cos,0.0)",pcVar14,&local_5b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_5a8);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_598);
  if (!bVar11) {
    testing::Message::Message(&local_5c0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_598);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x3b,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,&local_5c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(&local_5c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_598);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_5e8);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_5e8,3,3);
  std::complex<double>::complex(&local_5f8,dVar5,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_5d8,"Ryy.matrix()(3,3)","T(cos,0.0)",pcVar14,&local_5f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_5e8);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d8);
  if (!bVar11) {
    testing::Message::Message(&local_600);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_5d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x3c,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,&local_600);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(&local_600);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d8);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_628);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_628,3,0);
  std::complex<double>::complex
            (&local_638,0.0,
             (double)gtest_ar_16.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_618,"Ryy.matrix()(3,0)","T(0.0, sin)",pcVar14,&local_638);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_628);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_618);
  if (!bVar11) {
    testing::Message::Message(&local_640);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_618);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x3d,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_618);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_668);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_668,2,1);
  std::complex<double>::complex
            (&local_678,0.0,
             -(double)gtest_ar_16.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_658,"Ryy.matrix()(2,1)","T(0.0,-sin)",pcVar14,&local_678);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_668);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar11) {
    testing::Message::Message(&local_680);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x3e,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,&local_680);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(&local_680);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_6a8);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_6a8,1,2);
  std::complex<double>::complex
            (&local_6b8,0.0,
             -(double)gtest_ar_16.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_698,"Ryy.matrix()(1,2)","T(0.0,-sin)",pcVar14,&local_6b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_6a8);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_698);
  if (!bVar11) {
    testing::Message::Message(&local_6c0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_698);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x3f,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,&local_6c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(&local_6c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_698);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_6e8);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_6e8,0,3);
  std::complex<double>::complex
            (&local_6f8,0.0,
             (double)gtest_ar_16.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_6d8,"Ryy.matrix()(0,3)","T(0.0, sin)",pcVar14,&local_6f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_6e8);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d8);
  if (!bVar11) {
    testing::Message::Message(&local_700);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_6d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_24.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x40,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_24.message_,&local_700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_24.message_);
    testing::Message::~Message(&local_700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d8);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_728);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_728,1,0);
  std::complex<double>::complex(&local_738,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_718,"Ryy.matrix()(1,0)","T(0)",pcVar14,&local_738);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_728);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
  if (!bVar11) {
    testing::Message::Message(&local_740);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x41,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_25.message_,&local_740);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_25.message_);
    testing::Message::~Message(&local_740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_768);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_768,2,0);
  std::complex<double>::complex(&local_778,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_758,"Ryy.matrix()(2,0)","T(0)",pcVar14,&local_778);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_768);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_758);
  if (!bVar11) {
    testing::Message::Message(&local_780);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_26.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x42,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_26.message_,&local_780);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_26.message_);
    testing::Message::~Message(&local_780);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_758);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_7a8);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_7a8,0,1);
  std::complex<double>::complex(&local_7b8,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_798,"Ryy.matrix()(0,1)","T(0)",pcVar14,&local_7b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_7a8);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_798);
  if (!bVar11) {
    testing::Message::Message(&local_7c0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_798);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_27.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x43,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_27.message_,&local_7c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_27.message_);
    testing::Message::~Message(&local_7c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_798);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_7e8);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_7e8,3,1);
  std::complex<double>::complex(&local_7f8,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_7d8,"Ryy.matrix()(3,1)","T(0)",pcVar14,&local_7f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_7e8);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar11) {
    testing::Message::Message(&local_800);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_7d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_28.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x44,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_28.message_,&local_800);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_28.message_);
    testing::Message::~Message(&local_800);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_828);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_828,0,2);
  std::complex<double>::complex(&local_838,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_818,"Ryy.matrix()(0,2)","T(0)",pcVar14,&local_838);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_828);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar11) {
    testing::Message::Message(&local_840);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_818);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_29.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x45,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_29.message_,&local_840);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_29.message_);
    testing::Message::~Message(&local_840);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_868);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_868,3,2);
  std::complex<double>::complex(&local_878,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_858,"Ryy.matrix()(3,2)","T(0)",pcVar14,&local_878);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_868);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_858);
  if (!bVar11) {
    testing::Message::Message(&local_880);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_858);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_30.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x46,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_30.message_,&local_880);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_30.message_);
    testing::Message::~Message(&local_880);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_858);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_8a8);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_8a8,1,3);
  std::complex<double>::complex(&local_8b8,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_898,"Ryy.matrix()(1,3)","T(0)",pcVar14,&local_8b8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_8a8);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_898);
  if (!bVar11) {
    testing::Message::Message(&local_8c0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_898);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_31.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x47,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_31.message_,&local_8c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_31.message_);
    testing::Message::~Message(&local_8c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_898);
  qclab::qgates::RotationYY<std::complex<double>_>::matrix
            ((RotationYY<std::complex<double>_> *)local_8e8);
  pcVar14 = qclab::dense::SquareMatrix<std::complex<double>_>::operator()
                      ((SquareMatrix<std::complex<double>_> *)local_8e8,2,3);
  std::complex<double>::complex(&local_8f8,0.0,0.0);
  testing::internal::EqHelper::Compare<std::complex<double>,_std::complex<double>,_nullptr>
            ((EqHelper *)local_8d8,"Ryy.matrix()(2,3)","T(0)",pcVar14,&local_8f8);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_8e8);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_8d8);
  if (!bVar11) {
    testing::Message::Message(&local_900);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_8d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_908,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x48,pcVar12);
    testing::internal::AssertHelper::operator=(&local_908,&local_900);
    testing::internal::AssertHelper::~AssertHelper(&local_908);
    testing::Message::~Message(&local_900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_8d8);
  qclab::qgates::QGate2<std::complex<double>_>::print
            ((QGate2<std::complex<double>_> *)&gtest_ar.message_);
  std::__cxx11::stringstream::stringstream((stringstream *)&gtest_ar_32.message_);
  local_aa4 = qclab::qgates::RotationYY<std::complex<double>_>::toQASM
                        ((RotationYY<std::complex<double>_> *)&gtest_ar.message_,local_a80,0);
  local_aa8 = 0;
  pcVar12 = "Ryy.toQASM( qasm )";
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_aa0,"Ryy.toQASM( qasm )","0",&local_aa4,&local_aa8);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
  if (!bVar11) {
    testing::Message::Message(&local_ab0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_aa0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&str_theta.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x4f,pcVar12);
    pcVar12 = (char *)&local_ab0;
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&str_theta.field_2 + 8),(Message *)pcVar12);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&str_theta.field_2 + 8));
    testing::Message::~Message(&local_ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  qclab::qasm_abi_cxx11_((string *)((long)&qasm_check.field_2 + 8),(qclab *)pcVar12,rVar6);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &gtest_ar_33.message_,"ryy(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&qasm_check.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &gtest_ar_33.message_,") q[3], q[5];\n");
  std::__cxx11::string::~string((string *)&gtest_ar_33.message_);
  std::__cxx11::stringstream::str();
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_b28,"qasm.str()","qasm_check",&local_b48,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_af8);
  std::__cxx11::string::~string((string *)&local_b48);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b28);
  if (!bVar11) {
    testing::Message::Message(&local_b50);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_b28);
    testing::internal::AssertHelper::AssertHelper
              (&local_b58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x52,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b58,&local_b50);
    testing::internal::AssertHelper::~AssertHelper(&local_b58);
    testing::Message::~Message(&local_b50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b28);
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&std::cout,(string *)&gtest_ar_34.message_);
  std::__cxx11::string::~string((string *)&gtest_ar_34.message_);
  dVar5 = ::cos(dVar4 / 3.0);
  dVar7 = ::sin(dVar4 / 3.0);
  qclab::qgates::QRotationGate2<std::complex<double>_>::update
            ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,dVar5,dVar7);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,
                     (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05));
  dVar7 = ::cos(dVar4 / 3.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_b88,"Ryy.cos()","std::cos( pi/3 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b88);
  if (!bVar11) {
    testing::Message::Message(&local_b90);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_b88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_35.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x57,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_35.message_,&local_b90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_35.message_);
    testing::Message::~Message(&local_b90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b88);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_,
                     (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06));
  dVar7 = ::sin(dVar4 / 3.0);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_ba8,"Ryy.sin()","std::sin( pi/3 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ba8);
  if (!bVar11) {
    testing::Message::Message(&local_bb0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_ba8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_36.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x58,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_36.message_,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_36.message_);
    testing::Message::~Message(&local_bb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ba8);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_bc8,"Ryy.theta()","2*(pi/3)","tol",rVar6,dVar4 / 3.0 + dVar4 / 3.0,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc8);
  if (!bVar11) {
    testing::Message::Message(&local_bd0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_bc8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &Ryy2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x59,pcVar12);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &Ryy2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,&local_bd0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &Ryy2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_);
    testing::Message::~Message(&local_bd0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_bc8);
  dVar5 = ::cos(dVar4 / 3.0);
  dVar7 = ::sin(dVar4 / 3.0);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar__5.message_,dVar5,dVar7);
  local_c11 = qclab::QObject<std::complex<double>_>::operator==
                        ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                         (QObject<std::complex<double>_> *)&gtest_ar__5.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c10,&local_c11,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c10);
  if (!bVar11) {
    testing::Message::Message(&local_c20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__6.message_,(internal *)local_c10,
               (AssertionResult *)"Ryy == Ryy2","false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x5d,pcVar12);
    testing::internal::AssertHelper::operator=(&local_c28,&local_c20);
    testing::internal::AssertHelper::~AssertHelper(&local_c28);
    std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
    testing::Message::~Message(&local_c20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c10);
  bVar11 = qclab::QObject<std::complex<double>_>::operator!=
                     ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                      (QObject<std::complex<double>_> *)&gtest_ar__5.message_);
  local_c59 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_c58,&local_c59,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c58);
  if (!bVar11) {
    testing::Message::Message(&local_c68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__7.message_,(internal *)local_c58,
               (AssertionResult *)"Ryy != Ryy2","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x5e,pcVar12);
    testing::internal::AssertHelper::operator=(&local_c70,&local_c68);
    testing::internal::AssertHelper::~AssertHelper(&local_c70);
    std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_c68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c58);
  qclab::qgates::QRotationGate2<std::complex<double>_>::update
            ((QRotationGate2<std::complex<double>_> *)&gtest_ar__5.message_,1.0);
  local_ca1 = qclab::QObject<std::complex<double>_>::operator!=
                        ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                         (QObject<std::complex<double>_> *)&gtest_ar__5.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ca0,&local_ca1,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ca0);
  if (!bVar11) {
    testing::Message::Message(&local_cb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_ca0,
               (AssertionResult *)"Ryy != Ryy2","false","true",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x60,pcVar12);
    testing::internal::AssertHelper::operator=(&local_cb8,&local_cb0);
    testing::internal::AssertHelper::~AssertHelper(&local_cb8);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_cb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ca0);
  bVar11 = qclab::QObject<std::complex<double>_>::operator==
                     ((QObject<std::complex<double>_> *)&gtest_ar.message_,
                      (QObject<std::complex<double>_> *)&gtest_ar__5.message_);
  local_ce9 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ce8,&local_ce9,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ce8);
  if (!bVar11) {
    testing::Message::Message(&local_cf8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&rot.angle_.sin_,(internal *)local_ce8,(AssertionResult *)"Ryy == Ryy2",
               "true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x61,pcVar12);
    testing::internal::AssertHelper::operator=(&local_d00,&local_cf8);
    testing::internal::AssertHelper::~AssertHelper(&local_d00);
    std::__cxx11::string::~string((string *)&rot.angle_.sin_);
    testing::Message::~Message(&local_cf8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ce8);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar__5.message_);
  std::__cxx11::string::~string((string *)local_af8);
  std::__cxx11::string::~string((string *)(qasm_check.field_2._M_local_buf + 8));
  std::__cxx11::stringstream::~stringstream((stringstream *)&gtest_ar_32.message_);
  qclab::dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)&gtest_ar__2.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar.message_);
  pdVar1 = &Ryy_1.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)pdVar1,dVar4 * 0.5);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_37.message_,(rotation_type *)pdVar1);
  local_d6c = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                        ((QGate2<std::complex<double>_> *)&gtest_ar_37.message_);
  local_d70 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_d68,"Ryy.nbQubits()","2",&local_d6c,&local_d70);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d68);
  if (!bVar11) {
    testing::Message::Message(&local_d78);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_d68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x6b,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__9.message_,&local_d78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_d78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d68);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_37.message_);
  local_d91 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_d90,&local_d91,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d90);
  if (!bVar11) {
    testing::Message::Message(&local_da0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_d90,
               (AssertionResult *)"Ryy.fixed()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_da8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x6c,pcVar12);
    testing::internal::AssertHelper::operator=(&local_da8,&local_da0);
    testing::internal::AssertHelper::~AssertHelper(&local_da8);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_da0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d90);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_37.message_);
  local_dd9 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_dd8,&local_dd9,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_dd8);
  if (!bVar11) {
    testing::Message::Message(&local_de8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage,(internal *)local_dd8,(AssertionResult *)"Ryy.controlled()",
               "true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_df0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x6d,pcVar12);
    testing::internal::AssertHelper::operator=(&local_df0,&local_de8);
    testing::internal::AssertHelper::~AssertHelper(&local_df0);
    std::__cxx11::string::~string
              ((string *)
               &qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    testing::Message::~Message(&local_de8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_dd8);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_38.message_,
             (QRotationGate2<std::complex<double>_> *)&gtest_ar_37.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_38.message_,0);
  local_e3c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e38,"qubits[0]","0",pvVar13,&local_e3c);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e38);
  if (!bVar11) {
    testing::Message::Message(&local_e48);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_e38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_39.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x70,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_39.message_,&local_e48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_39.message_);
    testing::Message::~Message(&local_e48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e38);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_38.message_,1);
  local_e64 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e60,"qubits[1]","1",pvVar13,&local_e64);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e60);
  if (!bVar11) {
    testing::Message::Message(&local_e70);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_e60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_40.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x71,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_40.message_,&local_e70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_40.message_);
    testing::Message::~Message(&local_e70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e60);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_37.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_e88,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e88);
  if (!bVar11) {
    testing::Message::Message(&local_e90);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_e88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_41.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x73,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_41.message_,&local_e90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_41.message_);
    testing::Message::~Message(&local_e90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e88);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_37.message_,
                     (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07));
  dVar7 = ::cos(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_ea8,"Ryy.cos()","std::cos( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ea8);
  if (!bVar11) {
    testing::Message::Message(&local_eb0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_ea8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_42.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x74,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_42.message_,&local_eb0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_42.message_);
    testing::Message::~Message(&local_eb0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ea8);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_37.message_,
                     (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08));
  dVar7 = ::sin(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_ec8,"Ryy.sin()","std::sin( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec8);
  if (!bVar11) {
    testing::Message::Message(&local_ed0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_ec8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &Ryy_2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,
               kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x75,pcVar12);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &Ryy_2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,&local_ed0);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &Ryy_2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_);
    testing::Message::~Message(&local_ed0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_38.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_37.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_43.message_,dVar4 * 0.5);
  local_f14 = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                        ((QGate2<std::complex<double>_> *)&gtest_ar_43.message_);
  local_f18 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_f10,"Ryy.nbQubits()","2",&local_f14,&local_f18);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f10);
  if (!bVar11) {
    testing::Message::Message(&local_f20);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_f10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x7b,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__11.message_,&local_f20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_f20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f10);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_43.message_);
  local_f39 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f38,&local_f39,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f38);
  if (!bVar11) {
    testing::Message::Message(&local_f48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_f38,
               (AssertionResult *)"Ryy.fixed()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x7c,pcVar12);
    testing::internal::AssertHelper::operator=(&local_f50,&local_f48);
    testing::internal::AssertHelper::~AssertHelper(&local_f50);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_f48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f38);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_43.message_);
  local_f81 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f80,&local_f81,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f80);
  if (!bVar11) {
    testing::Message::Message(&local_f90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &qubits_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_f80,
               (AssertionResult *)"Ryy.controlled()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x7d,pcVar12);
    testing::internal::AssertHelper::operator=(&local_f98,&local_f90);
    testing::internal::AssertHelper::~AssertHelper(&local_f98);
    std::__cxx11::string::~string
              ((string *)
               &qubits_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_f90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f80);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_44.message_,
             (QRotationGate2<std::complex<double>_> *)&gtest_ar_43.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_44.message_,0);
  local_fe4 = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_fe0,"qubits[0]","0",pvVar13,&local_fe4);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fe0);
  if (!bVar11) {
    testing::Message::Message(&local_ff0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_fe0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_45.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x80,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_45.message_,&local_ff0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_45.message_);
    testing::Message::~Message(&local_ff0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_fe0);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_44.message_,1);
  local_100c = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1008,"qubits[1]","1",pvVar13,&local_100c);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1008);
  if (!bVar11) {
    testing::Message::Message(&local_1018);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1008);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_46.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x81,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_46.message_,&local_1018);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_46.message_);
    testing::Message::~Message(&local_1018);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1008);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_43.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1030,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1030);
  if (!bVar11) {
    testing::Message::Message(&local_1038);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1030);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_47.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x83,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_47.message_,&local_1038);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_47.message_);
    testing::Message::~Message(&local_1038);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1030);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_43.message_,
                     (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09));
  dVar7 = ::cos(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1050,"Ryy.cos()","std::cos( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1050);
  if (!bVar11) {
    testing::Message::Message(&local_1058);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1050);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_48.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x84,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_48.message_,&local_1058);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_48.message_);
    testing::Message::~Message(&local_1058);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1050);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_43.message_,
                     (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10));
  dVar7 = ::sin(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1070,"Ryy.sin()","std::sin( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1070);
  if (!bVar11) {
    testing::Message::Message(&local_1078);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1070);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cos_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x85,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cos_1,&local_1078);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cos_1);
    testing::Message::~Message(&local_1078);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1070);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_44.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_43.message_);
  dVar5 = ::cos(dVar4 * 0.25);
  dVar7 = ::sin(dVar4 * 0.25);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_49.message_,dVar5,dVar7);
  local_10cc = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                         ((QGate2<std::complex<double>_> *)&gtest_ar_49.message_);
  local_10d0 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_10c8,"Ryy.nbQubits()","2",&local_10cc,&local_10d0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10c8);
  if (!bVar11) {
    testing::Message::Message(&local_10d8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_10c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x8d,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__13.message_,&local_10d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__13.message_);
    testing::Message::~Message(&local_10d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10c8);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_49.message_);
  local_10f1 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_10f0,&local_10f1,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10f0);
  if (!bVar11) {
    testing::Message::Message(&local_1100);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__14.message_,(internal *)local_10f0,
               (AssertionResult *)"Ryy.fixed()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x8e,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1108,&local_1100);
    testing::internal::AssertHelper::~AssertHelper(&local_1108);
    std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
    testing::Message::~Message(&local_1100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10f0);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_49.message_);
  local_1139 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1138,&local_1139,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1138);
  if (!bVar11) {
    testing::Message::Message(&local_1148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &qubits_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_1138,
               (AssertionResult *)"Ryy.controlled()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1150,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x8f,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1150,&local_1148);
    testing::internal::AssertHelper::~AssertHelper(&local_1150);
    std::__cxx11::string::~string
              ((string *)
               &qubits_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1138);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_50.message_,
             (QRotationGate2<std::complex<double>_> *)&gtest_ar_49.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_50.message_,0);
  local_119c = 0;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1198,"qubits[0]","0",pvVar13,&local_119c);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1198);
  if (!bVar11) {
    testing::Message::Message(&local_11a8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_51.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x92,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_51.message_,&local_11a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_51.message_);
    testing::Message::~Message(&local_11a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1198);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_50.message_,1);
  local_11c4 = 1;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_11c0,"qubits[1]","1",pvVar13,&local_11c4);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11c0);
  if (!bVar11) {
    testing::Message::Message(&local_11d0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_11c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_52.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x93,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_52.message_,&local_11d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_52.message_);
    testing::Message::~Message(&local_11d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11c0);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_49.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_11e8,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_11e8);
  if (!bVar11) {
    testing::Message::Message(&local_11f0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_11e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_53.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x95,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_53.message_,&local_11f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_53.message_);
    testing::Message::~Message(&local_11f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_11e8);
  dVar8 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_49.message_,
                     (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1208,"Ryy.cos()","cos","tol",dVar8,dVar5,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1208);
  if (!bVar11) {
    testing::Message::Message(&local_1210);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1208);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_54.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x96,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_54.message_,&local_1210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_54.message_);
    testing::Message::~Message(&local_1210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1208);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_49.message_,
                     (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1228,"Ryy.sin()","sin","tol",dVar5,dVar7,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1228);
  if (!bVar11) {
    testing::Message::Message(&local_1230);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qbits,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x97,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)qbits,&local_1230);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qbits);
    testing::Message::~Message(&local_1230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1228);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_50.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_49.message_);
  rot_1.angle_.sin_ = 1.06099789563086e-313;
  pdVar1 = &Ryy_4.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)pdVar1,dVar4 * 0.5);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_55.message_,(int *)&rot_1.angle_.sin_,
             (rotation_type *)pdVar1,false);
  local_128c = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                         ((QGate2<std::complex<double>_> *)&gtest_ar_55.message_);
  local_1290 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1288,"Ryy.nbQubits()","2",&local_128c,&local_1290);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1288);
  if (!bVar11) {
    testing::Message::Message(&local_1298);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1288);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xa3,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__15.message_,&local_1298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__15.message_);
    testing::Message::~Message(&local_1298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1288);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_55.message_);
  local_12b1 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_12b0,&local_12b1,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12b0);
  if (!bVar11) {
    testing::Message::Message(&local_12c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__16.message_,(internal *)local_12b0,
               (AssertionResult *)"Ryy.fixed()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xa4,pcVar12);
    testing::internal::AssertHelper::operator=(&local_12c8,&local_12c0);
    testing::internal::AssertHelper::~AssertHelper(&local_12c8);
    std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
    testing::Message::~Message(&local_12c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12b0);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_55.message_);
  local_12f9 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_12f8,&local_12f9,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12f8);
  if (!bVar11) {
    testing::Message::Message(&local_1308);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &qubits_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_12f8,
               (AssertionResult *)"Ryy.controlled()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1310,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xa5,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1310,&local_1308);
    testing::internal::AssertHelper::~AssertHelper(&local_1310);
    std::__cxx11::string::~string
              ((string *)
               &qubits_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1308);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12f8);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_56.message_,
             (QRotationGate2<std::complex<double>_> *)&gtest_ar_55.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_56.message_,0);
  local_135c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1358,"qubits[0]","3",pvVar13,&local_135c);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1358);
  if (!bVar11) {
    testing::Message::Message(&local_1368);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1358);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_57.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xa8,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_57.message_,&local_1368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_57.message_);
    testing::Message::~Message(&local_1368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1358);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_56.message_,1);
  local_1384 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1380,"qubits[1]","5",pvVar13,&local_1384);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1380);
  if (!bVar11) {
    testing::Message::Message(&local_1390);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_58.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xa9,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_58.message_,&local_1390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_58.message_);
    testing::Message::~Message(&local_1390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1380);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_55.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_13a8,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13a8);
  if (!bVar11) {
    testing::Message::Message(&local_13b0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_13a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_59.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xab,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_59.message_,&local_13b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_59.message_);
    testing::Message::~Message(&local_13b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13a8);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_55.message_,
                     (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13));
  dVar7 = ::cos(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_13c8,"Ryy.cos()","std::cos( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13c8);
  if (!bVar11) {
    testing::Message::Message(&local_13d0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_13c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_60.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xac,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_60.message_,&local_13d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_60.message_);
    testing::Message::~Message(&local_13d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13c8);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_55.message_,
                     (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14));
  dVar7 = ::sin(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_13e8,"Ryy.sin()","std::sin( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13e8);
  if (!bVar11) {
    testing::Message::Message(&local_13f0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_13e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qbits_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xad,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)qbits_1,&local_13f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qbits_1);
    testing::Message::~Message(&local_13f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_13e8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_56.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_55.message_);
  Ryy_5.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_ = 1.06099789563086e-313;
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_61.message_,
             (int *)&Ryy_5.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,
             dVar4 * 0.5,false);
  local_143c = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                         ((QGate2<std::complex<double>_> *)&gtest_ar_61.message_);
  local_1440 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1438,"Ryy.nbQubits()","2",&local_143c,&local_1440);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1438);
  if (!bVar11) {
    testing::Message::Message(&local_1448);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1438);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xb4,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__17.message_,&local_1448);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__17.message_);
    testing::Message::~Message(&local_1448);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1438);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_61.message_);
  local_1461 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1460,&local_1461,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1460);
  if (!bVar11) {
    testing::Message::Message(&local_1470);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__18.message_,(internal *)local_1460,
               (AssertionResult *)"Ryy.fixed()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1478,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xb5,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1478,&local_1470);
    testing::internal::AssertHelper::~AssertHelper(&local_1478);
    std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
    testing::Message::~Message(&local_1470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1460);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_61.message_);
  local_14a9 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_14a8,&local_14a9,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14a8);
  if (!bVar11) {
    testing::Message::Message(&local_14b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &qubits_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_14a8,
               (AssertionResult *)"Ryy.controlled()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_14c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xb6,pcVar12);
    testing::internal::AssertHelper::operator=(&local_14c0,&local_14b8);
    testing::internal::AssertHelper::~AssertHelper(&local_14c0);
    std::__cxx11::string::~string
              ((string *)
               &qubits_4.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_14b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14a8);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_62.message_,
             (QRotationGate2<std::complex<double>_> *)&gtest_ar_61.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_62.message_,0);
  local_150c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1508,"qubits[0]","3",pvVar13,&local_150c);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1508);
  if (!bVar11) {
    testing::Message::Message(&local_1518);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_63.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xb9,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_63.message_,&local_1518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_63.message_);
    testing::Message::~Message(&local_1518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1508);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_62.message_,1);
  local_1534 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1530,"qubits[1]","5",pvVar13,&local_1534);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1530);
  if (!bVar11) {
    testing::Message::Message(&local_1540);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_64.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xba,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_64.message_,&local_1540);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_64.message_);
    testing::Message::~Message(&local_1540);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1530);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_61.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1558,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1558);
  if (!bVar11) {
    testing::Message::Message(&local_1560);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1558);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_65.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xbc,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_65.message_,&local_1560);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_65.message_);
    testing::Message::~Message(&local_1560);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1558);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_61.message_,
                     (double)CONCAT44(extraout_XMM0_Db_15,extraout_XMM0_Da_15));
  dVar7 = ::cos(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1578,"Ryy.cos()","std::cos( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1578);
  if (!bVar11) {
    testing::Message::Message(&local_1580);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1578);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_66.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xbd,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_66.message_,&local_1580);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_66.message_);
    testing::Message::~Message(&local_1580);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1578);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_61.message_,
                     (double)CONCAT44(extraout_XMM0_Db_16,extraout_XMM0_Da_16));
  dVar7 = ::sin(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1598,"Ryy.sin()","std::sin( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1598);
  if (!bVar11) {
    testing::Message::Message(&local_15a0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1598);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)qbits_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xbe,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)qbits_2,&local_15a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)qbits_2);
    testing::Message::~Message(&local_15a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1598);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_62.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_61.message_);
  cos_2 = 1.06099789563086e-313;
  dVar5 = ::cos(dVar4 * 0.25);
  dVar7 = ::sin(dVar4 * 0.25);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_67.message_,(int *)&cos_2,dVar5,dVar7,
             false);
  local_15fc = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                         ((QGate2<std::complex<double>_> *)&gtest_ar_67.message_);
  local_1600 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_15f8,"Ryy.nbQubits()","2",&local_15fc,&local_1600);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15f8);
  if (!bVar11) {
    testing::Message::Message(&local_1608);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_15f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,199,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__19.message_,&local_1608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__19.message_);
    testing::Message::~Message(&local_1608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_15f8);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_67.message_);
  local_1621 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1620,&local_1621,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1620);
  if (!bVar11) {
    testing::Message::Message(&local_1630);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__20.message_,(internal *)local_1620,
               (AssertionResult *)"Ryy.fixed()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1638,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,200,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1638,&local_1630);
    testing::internal::AssertHelper::~AssertHelper(&local_1638);
    std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
    testing::Message::~Message(&local_1630);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1620);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_67.message_);
  local_1669 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1668,&local_1669,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1668);
  if (!bVar11) {
    testing::Message::Message(&local_1678);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &qubits_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_1668,
               (AssertionResult *)"Ryy.controlled()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1680,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xc9,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1680,&local_1678);
    testing::internal::AssertHelper::~AssertHelper(&local_1680);
    std::__cxx11::string::~string
              ((string *)
               &qubits_5.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1678);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1668);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_68.message_,
             (QRotationGate2<std::complex<double>_> *)&gtest_ar_67.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_68.message_,0);
  local_16cc = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_16c8,"qubits[0]","3",pvVar13,&local_16cc);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16c8);
  if (!bVar11) {
    testing::Message::Message(&local_16d8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_16c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_69.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xcc,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_69.message_,&local_16d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_69.message_);
    testing::Message::~Message(&local_16d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16c8);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_68.message_,1);
  local_16f4 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_16f0,"qubits[1]","5",pvVar13,&local_16f4);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_16f0);
  if (!bVar11) {
    testing::Message::Message(&local_1700);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_16f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_70.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xcd,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_70.message_,&local_1700);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_70.message_);
    testing::Message::~Message(&local_1700);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_16f0);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_67.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1718,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1718);
  if (!bVar11) {
    testing::Message::Message(&local_1720);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1718);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_71.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xcf,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_71.message_,&local_1720);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_71.message_);
    testing::Message::~Message(&local_1720);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1718);
  dVar8 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_67.message_,
                     (double)CONCAT44(extraout_XMM0_Db_17,extraout_XMM0_Da_17));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1738,"Ryy.cos()","cos","tol",dVar8,dVar5,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1738);
  if (!bVar11) {
    testing::Message::Message(&local_1740);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1738);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_72.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xd0,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_72.message_,&local_1740);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_72.message_);
    testing::Message::~Message(&local_1740);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1738);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_67.message_,
                     (double)CONCAT44(extraout_XMM0_Db_18,extraout_XMM0_Da_18));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1758,"Ryy.sin()","sin","tol",dVar5,dVar7,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1758);
  if (!bVar11) {
    testing::Message::Message(&local_1760);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1758);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubit1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xd1,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubit1,&local_1760);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubit1);
    testing::Message::~Message(&local_1760);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1758);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_68.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_67.message_);
  pdVar1 = &Ryy_7.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)pdVar1,dVar4 * 0.5);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_73.message_,3,5,(rotation_type *)pdVar1,
             false);
  local_17bc = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                         ((QGate2<std::complex<double>_> *)&gtest_ar_73.message_);
  local_17c0 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_17b8,"Ryy.nbQubits()","2",&local_17bc,&local_17c0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17b8);
  if (!bVar11) {
    testing::Message::Message(&local_17c8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_17b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xde,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__21.message_,&local_17c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__21.message_);
    testing::Message::~Message(&local_17c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17b8);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_73.message_);
  local_17e1 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_17e0,&local_17e1,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_17e0);
  if (!bVar11) {
    testing::Message::Message(&local_17f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__22.message_,(internal *)local_17e0,
               (AssertionResult *)"Ryy.fixed()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_17f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xdf,pcVar12);
    testing::internal::AssertHelper::operator=(&local_17f8,&local_17f0);
    testing::internal::AssertHelper::~AssertHelper(&local_17f8);
    std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
    testing::Message::~Message(&local_17f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_17e0);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_73.message_);
  local_1829 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1828,&local_1829,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1828);
  if (!bVar11) {
    testing::Message::Message(&local_1838);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &qubits_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_1828,
               (AssertionResult *)"Ryy.controlled()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xe0,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1840,&local_1838);
    testing::internal::AssertHelper::~AssertHelper(&local_1840);
    std::__cxx11::string::~string
              ((string *)
               &qubits_6.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1838);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1828);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_74.message_,
             (QRotationGate2<std::complex<double>_> *)&gtest_ar_73.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_74.message_,0);
  local_188c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1888,"qubits[0]","3",pvVar13,&local_188c);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1888);
  if (!bVar11) {
    testing::Message::Message(&local_1898);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1888);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_75.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xe3,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_75.message_,&local_1898);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_75.message_);
    testing::Message::~Message(&local_1898);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1888);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_74.message_,1);
  local_18b4 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_18b0,"qubits[1]","5",pvVar13,&local_18b4);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18b0);
  if (!bVar11) {
    testing::Message::Message(&local_18c0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_18b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_76.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xe4,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_76.message_,&local_18c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_76.message_);
    testing::Message::~Message(&local_18c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18b0);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_73.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_18d8,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18d8);
  if (!bVar11) {
    testing::Message::Message(&local_18e0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_18d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_77.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xe6,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_77.message_,&local_18e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_77.message_);
    testing::Message::~Message(&local_18e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18d8);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_73.message_,
                     (double)CONCAT44(extraout_XMM0_Db_19,extraout_XMM0_Da_19));
  dVar7 = ::cos(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_18f8,"Ryy.cos()","std::cos( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_18f8);
  if (!bVar11) {
    testing::Message::Message(&local_1900);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_18f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_78.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xe7,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_78.message_,&local_1900);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_78.message_);
    testing::Message::~Message(&local_1900);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_18f8);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_73.message_,
                     (double)CONCAT44(extraout_XMM0_Db_20,extraout_XMM0_Da_20));
  dVar7 = ::sin(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1918,"Ryy.sin()","std::sin( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1918);
  if (!bVar11) {
    testing::Message::Message(&local_1920);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1918);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubit1_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xe8,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubit1_1,&local_1920);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubit1_1);
    testing::Message::~Message(&local_1920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1918);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_74.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_73.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_79.message_,3,5,dVar4 * 0.5,false);
  local_196c = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                         ((QGate2<std::complex<double>_> *)&gtest_ar_79.message_);
  local_1970 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1968,"Ryy.nbQubits()","2",&local_196c,&local_1970);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1968);
  if (!bVar11) {
    testing::Message::Message(&local_1978);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1968);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xf0,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__23.message_,&local_1978);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__23.message_);
    testing::Message::~Message(&local_1978);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1968);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_79.message_);
  local_1991 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1990,&local_1991,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1990);
  if (!bVar11) {
    testing::Message::Message(&local_19a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__24.message_,(internal *)local_1990,
               (AssertionResult *)"Ryy.fixed()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xf1,pcVar12);
    testing::internal::AssertHelper::operator=(&local_19a8,&local_19a0);
    testing::internal::AssertHelper::~AssertHelper(&local_19a8);
    std::__cxx11::string::~string((string *)&gtest_ar__24.message_);
    testing::Message::~Message(&local_19a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1990);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_79.message_);
  local_19d9 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_19d8,&local_19d9,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_19d8);
  if (!bVar11) {
    testing::Message::Message(&local_19e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &qubits_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_19d8,
               (AssertionResult *)"Ryy.controlled()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xf2,pcVar12);
    testing::internal::AssertHelper::operator=(&local_19f0,&local_19e8);
    testing::internal::AssertHelper::~AssertHelper(&local_19f0);
    std::__cxx11::string::~string
              ((string *)
               &qubits_7.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_19e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_19d8);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_80.message_,
             (QRotationGate2<std::complex<double>_> *)&gtest_ar_79.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_80.message_,0);
  local_1a3c = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1a38,"qubits[0]","3",pvVar13,&local_1a3c);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a38);
  if (!bVar11) {
    testing::Message::Message(&local_1a48);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1a38);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_81.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xf5,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_81.message_,&local_1a48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_81.message_);
    testing::Message::~Message(&local_1a48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a38);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_80.message_,1);
  local_1a64 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1a60,"qubits[1]","5",pvVar13,&local_1a64);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a60);
  if (!bVar11) {
    testing::Message::Message(&local_1a70);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1a60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_82.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xf6,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_82.message_,&local_1a70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_82.message_);
    testing::Message::~Message(&local_1a70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a60);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_79.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1a88,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a88);
  if (!bVar11) {
    testing::Message::Message(&local_1a90);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1a88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_83.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xf8,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_83.message_,&local_1a90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_83.message_);
    testing::Message::~Message(&local_1a90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a88);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_79.message_,
                     (double)CONCAT44(extraout_XMM0_Db_21,extraout_XMM0_Da_21));
  dVar7 = ::cos(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1aa8,"Ryy.cos()","std::cos( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1aa8);
  if (!bVar11) {
    testing::Message::Message(&local_1ab0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1aa8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_84.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xf9,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_84.message_,&local_1ab0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_84.message_);
    testing::Message::~Message(&local_1ab0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1aa8);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_79.message_,
                     (double)CONCAT44(extraout_XMM0_Db_22,extraout_XMM0_Da_22));
  dVar7 = ::sin(dVar4 * 0.25);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1ac8,"Ryy.sin()","std::sin( pi/4 )","tol",dVar5,dVar7,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ac8);
  if (!bVar11) {
    testing::Message::Message(&local_1ad0);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1ac8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&qubit1_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0xfa,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&qubit1_2,&local_1ad0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&qubit1_2);
    testing::Message::~Message(&local_1ad0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ac8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_80.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_79.message_);
  dVar5 = ::cos(dVar4 * 0.25);
  dVar7 = ::sin(dVar4 * 0.25);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_85.message_,3,5,dVar5,dVar7,false);
  local_1b2c = qclab::qgates::QGate2<std::complex<double>_>::nbQubits
                         ((QGate2<std::complex<double>_> *)&gtest_ar_85.message_);
  local_1b30 = 2;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1b28,"Ryy.nbQubits()","2",&local_1b2c,&local_1b30);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b28);
  if (!bVar11) {
    testing::Message::Message(&local_1b38);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1b28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__25.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x104,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__25.message_,&local_1b38);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__25.message_);
    testing::Message::~Message(&local_1b38);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b28);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::fixed
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_85.message_);
  local_1b51 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b50,&local_1b51,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b50);
  if (!bVar11) {
    testing::Message::Message(&local_1b60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__26.message_,(internal *)local_1b50,
               (AssertionResult *)"Ryy.fixed()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x105,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1b68,&local_1b60);
    testing::internal::AssertHelper::~AssertHelper(&local_1b68);
    std::__cxx11::string::~string((string *)&gtest_ar__26.message_);
    testing::Message::~Message(&local_1b60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b50);
  bVar11 = qclab::qgates::QRotationGate2<std::complex<double>_>::controlled
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_85.message_);
  local_1b99 = (bool)(~bVar11 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1b98,&local_1b99,(type *)0x0);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b98);
  if (!bVar11) {
    testing::Message::Message(&local_1ba8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               &qubits_8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(internal *)local_1b98,
               (AssertionResult *)"Ryy.controlled()","true","false",in_R9);
    pcVar12 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1bb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x106,pcVar12);
    testing::internal::AssertHelper::operator=(&local_1bb0,&local_1ba8);
    testing::internal::AssertHelper::~AssertHelper(&local_1bb0);
    std::__cxx11::string::~string
              ((string *)
               &qubits_8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    testing::Message::~Message(&local_1ba8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b98);
  qclab::qgates::QRotationGate2<std::complex<double>_>::qubits
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_86.message_,
             (QRotationGate2<std::complex<double>_> *)&gtest_ar_85.message_);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_86.message_,0);
  local_1bfc = 3;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1bf8,"qubits[0]","3",pvVar13,&local_1bfc);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bf8);
  if (!bVar11) {
    testing::Message::Message(&local_1c08);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1bf8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_87.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x109,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_87.message_,&local_1c08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_87.message_);
    testing::Message::~Message(&local_1c08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bf8);
  pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)&gtest_ar_86.message_,1);
  local_1c24 = 5;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1c20,"qubits[1]","5",pvVar13,&local_1c24);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c20);
  if (!bVar11) {
    testing::Message::Message(&local_1c30);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1c20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_88.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x10a,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_88.message_,&local_1c30);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_88.message_);
    testing::Message::~Message(&local_1c30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c20);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_85.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1c48,"Ryy.theta()","pi/2","tol",rVar6,dVar4 * 0.5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c48);
  if (!bVar11) {
    testing::Message::Message(&local_1c50);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1c48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_89.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x10c,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_89.message_,&local_1c50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_89.message_);
    testing::Message::~Message(&local_1c50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c48);
  dVar8 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_85.message_,
                     (double)CONCAT44(extraout_XMM0_Db_23,extraout_XMM0_Da_23));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1c68,"Ryy.cos()","cos","tol",dVar8,dVar5,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c68);
  if (!bVar11) {
    testing::Message::Message(&local_1c70);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1c68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_90.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x10d,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_90.message_,&local_1c70);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_90.message_);
    testing::Message::~Message(&local_1c70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c68);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_85.message_,
                     (double)CONCAT44(extraout_XMM0_Db_24,extraout_XMM0_Da_24));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1c88,"Ryy.sin()","sin","tol",dVar5,dVar7,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c88);
  if (!bVar11) {
    testing::Message::Message(&local_1c90);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1c88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x10e,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1,&local_1c90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1);
    testing::Message::~Message(&local_1c90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c88);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_86.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_85.message_);
  pdVar1 = &rot1.angle_.sin_;
  qclab::QAngle<double>::QAngle((QAngle<double> *)pdVar1,dVar4 * 0.5);
  pdVar2 = &R1.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)pdVar2,(angle_type *)pdVar1);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&theta2,0,1,(rotation_type *)pdVar2,false);
  dVar5 = dVar4 / 3.0;
  qclab::QAngle<double>::QAngle((QAngle<double> *)&rot2.angle_.sin_,dVar5);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)
             &R2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,
             (angle_type *)&rot2.angle_.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&angle.sin_,0,1,
             (rotation_type *)&R2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,
             false);
  pQVar15 = (QAngle<double> *)&angle.sin_;
  qclab::qgates::RotationYY<std::complex<double>_>::operator*=
            ((RotationYY<std::complex<double>_> *)&theta2,
             (RotationYY<std::complex<double>_> *)pQVar15);
  QVar16.sin_ = angle1.cos_;
  QVar16.cos_ = rot1.angle_.sin_;
  QVar16 = qclab::operator+((qclab *)&rot2.angle_.sin_,QVar16,pQVar15);
  angle.cos_ = QVar16.sin_;
  local_1d48 = (undefined1  [8])QVar16.cos_;
  dVar7 = qclab::QAngle<double>::cos((QAngle<double> *)local_1d48,angle.cos_);
  dVar8 = qclab::QAngle<double>::sin((QAngle<double> *)local_1d48,dVar7);
  gtest_ar_91.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )qclab::QAngle<double>::theta((QAngle<double> *)local_1d48);
  dVar9 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&theta2,
                     (double)gtest_ar_91.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1d80,"R1.cos()","cos","tol",dVar9,dVar7,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d80);
  if (!bVar11) {
    testing::Message::Message(&local_1d88);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1d80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_92.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x122,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_92.message_,&local_1d88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_92.message_);
    testing::Message::~Message(&local_1d88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d80);
  dVar7 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&theta2,
                     (double)CONCAT44(extraout_XMM0_Db_25,extraout_XMM0_Da_25));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1da0,"R1.sin()","sin","tol",dVar7,dVar8,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1da0);
  if (!bVar11) {
    testing::Message::Message(&local_1da8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1da0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_93.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x123,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_93.message_,&local_1da8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_93.message_);
    testing::Message::~Message(&local_1da8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1da0);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&theta2);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1dc0,"R1.theta()","2*theta","tol",rVar6,
             (double)gtest_ar_91.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl +
             (double)gtest_ar_91.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1dc0);
  if (!bVar11) {
    testing::Message::Message(&local_1dc8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1dc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_94.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x124,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_94.message_,&local_1dc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_94.message_);
    testing::Message::~Message(&local_1dc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1dc0);
  dVar7 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&angle.sin_,
                     (double)CONCAT44(extraout_XMM0_Db_26,extraout_XMM0_Da_26));
  dVar8 = ::cos(dVar5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1de0,"R2.cos()","std::cos( theta2 )","tol",dVar7,dVar8,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1de0);
  if (!bVar11) {
    testing::Message::Message(&local_1de8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1de0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_95.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x125,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_95.message_,&local_1de8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_95.message_);
    testing::Message::~Message(&local_1de8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1de0);
  dVar7 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&angle.sin_,
                     (double)CONCAT44(extraout_XMM0_Db_27,extraout_XMM0_Da_27));
  dVar8 = ::sin(dVar5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1e00,"R2.sin()","std::sin( theta2 )","tol",dVar7,dVar8,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e00);
  if (!bVar11) {
    testing::Message::Message(&local_1e08);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1e00);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_96.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x126,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_96.message_,&local_1e08);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_96.message_);
    testing::Message::~Message(&local_1e08);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e00);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&angle.sin_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1e20,"R2.theta()","2*theta2","tol",rVar6,dVar5 + dVar5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e20);
  if (!bVar11) {
    testing::Message::Message(&local_1e28);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1e20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x127,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_1,&local_1e28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_1);
    testing::Message::~Message(&local_1e28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e20);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&angle.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&theta2);
  pdVar1 = &rot1_1.angle_.sin_;
  qclab::QAngle<double>::QAngle((QAngle<double> *)pdVar1,dVar4 * 0.5);
  pdVar2 = &R1_1.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)pdVar2,(angle_type *)pdVar1);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&theta2_1,0,1,(rotation_type *)pdVar2,false);
  dVar5 = dVar4 / 3.0;
  qclab::QAngle<double>::QAngle((QAngle<double> *)&rot2_1.angle_.sin_,dVar5);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)
             &R2_1.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,
             (angle_type *)&rot2_1.angle_.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&angle_1.sin_,0,1,
             (rotation_type *)
             &R2_1.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,false);
  pQVar15 = (QAngle<double> *)&angle_1.sin_;
  qclab::qgates::RotationYY<std::complex<double>_>::operator/=
            ((RotationYY<std::complex<double>_> *)&theta2_1,
             (RotationYY<std::complex<double>_> *)pQVar15);
  lhs_01.sin_ = angle1_1.cos_;
  lhs_01.cos_ = rot1_1.angle_.sin_;
  QVar16 = qclab::operator-((qclab *)&rot2_1.angle_.sin_,lhs_01,pQVar15);
  angle_1.cos_ = QVar16.sin_;
  local_1ee0 = (undefined1  [8])QVar16.cos_;
  dVar7 = qclab::QAngle<double>::cos((QAngle<double> *)local_1ee0,angle_1.cos_);
  dVar8 = qclab::QAngle<double>::sin((QAngle<double> *)local_1ee0,dVar7);
  gtest_ar_97.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )qclab::QAngle<double>::theta((QAngle<double> *)local_1ee0);
  dVar9 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&theta2_1,
                     (double)gtest_ar_97.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1f20,"R1.cos()","cos","tol",dVar9,dVar7,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f20);
  if (!bVar11) {
    testing::Message::Message(&local_1f28);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1f20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_98.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x13b,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_98.message_,&local_1f28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_98.message_);
    testing::Message::~Message(&local_1f28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f20);
  dVar7 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&theta2_1,
                     (double)CONCAT44(extraout_XMM0_Db_28,extraout_XMM0_Da_28));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1f40,"R1.sin()","sin","tol",dVar7,dVar8,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f40);
  if (!bVar11) {
    testing::Message::Message(&local_1f48);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1f40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_99.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x13c,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_99.message_,&local_1f48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_99.message_);
    testing::Message::~Message(&local_1f48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f40);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&theta2_1);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1f60,"R1.theta()","2*theta","tol",rVar6,
             (double)gtest_ar_97.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl +
             (double)gtest_ar_97.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f60);
  if (!bVar11) {
    testing::Message::Message(&local_1f68);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1f60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_100.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x13d,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_100.message_,&local_1f68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_100.message_);
    testing::Message::~Message(&local_1f68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f60);
  dVar7 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&angle_1.sin_,
                     (double)CONCAT44(extraout_XMM0_Db_29,extraout_XMM0_Da_29));
  dVar8 = ::cos(dVar5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1f80,"R2.cos()","std::cos( theta2 )","tol",dVar7,dVar8,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f80);
  if (!bVar11) {
    testing::Message::Message(&local_1f88);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1f80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_101.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x13e,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_101.message_,&local_1f88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_101.message_);
    testing::Message::~Message(&local_1f88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f80);
  dVar7 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&angle_1.sin_,
                     (double)CONCAT44(extraout_XMM0_Db_30,extraout_XMM0_Da_30));
  dVar8 = ::sin(dVar5);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1fa0,"R2.sin()","std::sin( theta2 )","tol",dVar7,dVar8,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1fa0);
  if (!bVar11) {
    testing::Message::Message(&local_1fa8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1fa0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_102.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x13f,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_102.message_,&local_1fa8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_102.message_);
    testing::Message::~Message(&local_1fa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1fa0);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&angle_1.sin_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_1fc0,"R2.theta()","2*theta2","tol",rVar6,dVar5 + dVar5,
             2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1fc0);
  if (!bVar11) {
    testing::Message::Message(&local_1fc8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_1fc0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x140,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_2,&local_1fc8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_2);
    testing::Message::~Message(&local_1fc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1fc0);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&angle_1.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&theta2_1);
  pdVar1 = &rot1_2.angle_.sin_;
  qclab::QAngle<double>::QAngle((QAngle<double> *)pdVar1,dVar4 * 0.5);
  pdVar2 = &R1_2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)pdVar2,(angle_type *)pdVar1);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&theta2_2,0,1,(rotation_type *)pdVar2,false);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&rot2_2.angle_.sin_,dVar4 / 3.0);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)
             &R2_2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,
             (angle_type *)&rot2_2.angle_.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)
             &R12.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,0,1,
             (rotation_type *)
             &R2_2.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,false);
  pQVar15 = (QAngle<double> *)&angle_2.sin_;
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)pQVar15,
             (RotationYY<std::complex<double>_> *)&theta2_2);
  qclab::qgates::operator*
            ((RotationYY<std::complex<double>_> *)local_2098,
             (RotationYY<std::complex<double>_> *)pQVar15,
             (RotationYY<std::complex<double>_> *)
             &R12.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&angle_2.sin_);
  lhs_00.sin_ = angle1_2.cos_;
  lhs_00.cos_ = rot1_2.angle_.sin_;
  QVar16 = qclab::operator+((qclab *)&rot2_2.angle_.sin_,lhs_00,pQVar15);
  angle_2.cos_ = QVar16.sin_;
  local_20d0 = (undefined1  [8])QVar16.cos_;
  dVar5 = qclab::QAngle<double>::cos((QAngle<double> *)local_20d0,angle_2.cos_);
  dVar7 = qclab::QAngle<double>::sin((QAngle<double> *)local_20d0,dVar5);
  gtest_ar_103.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )qclab::QAngle<double>::theta((QAngle<double> *)local_20d0);
  dVar8 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)local_2098,
                     (double)gtest_ar_103.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2110,"R12.cos()","cos","tol",dVar8,dVar5,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2110);
  if (!bVar11) {
    testing::Message::Message(&local_2118);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_2110);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_104.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x154,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_104.message_,&local_2118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_104.message_);
    testing::Message::~Message(&local_2118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2110);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)local_2098,
                     (double)CONCAT44(extraout_XMM0_Db_31,extraout_XMM0_Da_31));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2130,"R12.sin()","sin","tol",dVar5,dVar7,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2130);
  if (!bVar11) {
    testing::Message::Message(&local_2138);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_2130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_105.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x155,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_105.message_,&local_2138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_105.message_);
    testing::Message::~Message(&local_2138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2130);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)local_2098);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2150,"R12.theta()","2*theta","tol",rVar6,
             (double)gtest_ar_103.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl +
             (double)gtest_ar_103.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2150);
  if (!bVar11) {
    testing::Message::Message(&local_2158);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_2150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x156,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_3,&local_2158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_3);
    testing::Message::~Message(&local_2158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2150);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)local_2098);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)
             &R12.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&theta2_2);
  pdVar1 = &rot1_3.angle_.sin_;
  qclab::QAngle<double>::QAngle((QAngle<double> *)pdVar1,dVar4 * 0.5);
  pdVar2 = &R1_3.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)pdVar2,(angle_type *)pdVar1);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&theta2_3,0,1,(rotation_type *)pdVar2,false);
  qclab::QAngle<double>::QAngle((QAngle<double> *)&rot2_3.angle_.sin_,dVar4 / 3.0);
  qclab::QRotation<double>::QRotation
            ((QRotation<double> *)
             &R2_3.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,
             (angle_type *)&rot2_3.angle_.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)
             &R12_1.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,0,1,
             (rotation_type *)
             &R2_3.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_,false);
  pQVar15 = (QAngle<double> *)&angle_3.sin_;
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)pQVar15,
             (RotationYY<std::complex<double>_> *)&theta2_3);
  qclab::qgates::operator/
            ((RotationYY<std::complex<double>_> *)local_2228,
             (RotationYY<std::complex<double>_> *)pQVar15,
             (RotationYY<std::complex<double>_> *)
             &R12_1.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&angle_3.sin_);
  lhs.sin_ = angle1_3.cos_;
  lhs.cos_ = rot1_3.angle_.sin_;
  QVar16 = qclab::operator-((qclab *)&rot2_3.angle_.sin_,lhs,pQVar15);
  angle_3.cos_ = QVar16.sin_;
  local_2260 = (undefined1  [8])QVar16.cos_;
  dVar5 = qclab::QAngle<double>::cos((QAngle<double> *)local_2260,angle_3.cos_);
  dVar7 = qclab::QAngle<double>::sin((QAngle<double> *)local_2260,dVar5);
  gtest_ar_106.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )qclab::QAngle<double>::theta((QAngle<double> *)local_2260);
  dVar8 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)local_2228,
                     (double)gtest_ar_106.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_22a0,"R12.cos()","cos","tol",dVar8,dVar5,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_22a0);
  if (!bVar11) {
    testing::Message::Message(&local_22a8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_22a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_107.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x16a,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_107.message_,&local_22a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_107.message_);
    testing::Message::~Message(&local_22a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_22a0);
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)local_2228,
                     (double)CONCAT44(extraout_XMM0_Db_32,extraout_XMM0_Da_32));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_22c0,"R12.sin()","sin","tol",dVar5,dVar7,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_22c0);
  if (!bVar11) {
    testing::Message::Message(&local_22c8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_22c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_108.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x16b,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_108.message_,&local_22c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_108.message_);
    testing::Message::~Message(&local_22c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_22c0);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)local_2228);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_22e0,"R12.theta()","2*theta","tol",rVar6,
             (double)gtest_ar_106.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl +
             (double)gtest_ar_106.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_22e0);
  if (!bVar11) {
    testing::Message::Message(&local_22e8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_22e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&theta1_4,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x16c,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&theta1_4,&local_22e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&theta1_4);
    testing::Message::~Message(&local_22e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_22e0);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)local_2228);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)
             &R12_1.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&theta2_3);
  pdVar1 = &rot1_4.angle_.sin_;
  qclab::QAngle<double>::QAngle((QAngle<double> *)pdVar1,dVar4 * 0.5);
  pdVar2 = &R1_4.super_QRotationGate2<std::complex<double>_>.rotation_.angle_.sin_;
  qclab::QRotation<double>::QRotation((QRotation<double> *)pdVar2,(angle_type *)pdVar1);
  qclab::qgates::RotationYY<std::complex<double>_>::RotationYY
            ((RotationYY<std::complex<double>_> *)&cos_8,0,1,(rotation_type *)pdVar2,false);
  dVar4 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&cos_8,
                     (double)CONCAT44(extraout_XMM0_Db_33,extraout_XMM0_Da_33));
  dVar5 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&cos_8,dVar4);
  rVar6 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                    ((QRotationGate2<std::complex<double>_> *)&cos_8);
  qclab::qgates::RotationYY<std::complex<double>_>::inv
            ((RotationYY<std::complex<double>_> *)&gtest_ar_109.message_,
             (RotationYY<std::complex<double>_> *)&cos_8);
  dVar7 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&cos_8,
                     (double)CONCAT44(extraout_XMM0_Db_34,extraout_XMM0_Da_34));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2390,"R1.cos()","cos","tol",dVar7,dVar4,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2390);
  if (!bVar11) {
    testing::Message::Message(&local_2398);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_2390);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_110.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x17a,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_110.message_,&local_2398);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_110.message_);
    testing::Message::~Message(&local_2398);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2390);
  dVar7 = qclab::qgates::QRotationGate2<std::complex<double>_>::cos
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_109.message_,
                     (double)CONCAT44(extraout_XMM0_Db_35,extraout_XMM0_Da_35));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_23b0,"R2.cos()","cos","tol",dVar7,dVar4,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_23b0);
  if (!bVar11) {
    testing::Message::Message(&local_23b8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_23b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_111.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x17b,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_111.message_,&local_23b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_111.message_);
    testing::Message::~Message(&local_23b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_23b0);
  dVar4 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&cos_8,
                     (double)CONCAT44(extraout_XMM0_Db_36,extraout_XMM0_Da_36));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_23d0,"R1.sin()","sin","tol",dVar4,dVar5,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_23d0);
  if (!bVar11) {
    testing::Message::Message(&local_23d8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_23d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_112.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x17c,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_112.message_,&local_23d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_112.message_);
    testing::Message::~Message(&local_23d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_23d0);
  dVar4 = qclab::qgates::QRotationGate2<std::complex<double>_>::sin
                    ((QRotationGate2<std::complex<double>_> *)&gtest_ar_109.message_,
                     (double)CONCAT44(extraout_XMM0_Db_37,extraout_XMM0_Da_37));
  testing::internal::DoubleNearPredFormat
            ((internal *)local_23f0,"R2.sin()","-sin","tol",dVar4,-dVar5,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_23f0);
  if (!bVar11) {
    testing::Message::Message(&local_23f8);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_23f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_113.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x17d,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_113.message_,&local_23f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_113.message_);
    testing::Message::~Message(&local_23f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_23f0);
  rVar10 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                     ((QRotationGate2<std::complex<double>_> *)&cos_8);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2410,"R1.theta()","theta","tol",rVar10,rVar6,2.220446049250313e-15);
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2410);
  if (!bVar11) {
    testing::Message::Message(&local_2418);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_2410);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_114.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x17e,pcVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_114.message_,&local_2418);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_114.message_);
    testing::Message::~Message(&local_2418);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2410);
  rVar10 = qclab::qgates::QRotationGate2<std::complex<double>_>::theta
                     ((QRotationGate2<std::complex<double>_> *)&gtest_ar_109.message_);
  testing::internal::DoubleNearPredFormat
            ((internal *)local_2430,"R2.theta()","-theta","tol",rVar10,-rVar6,2.220446049250313e-15)
  ;
  bVar11 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2430);
  if (!bVar11) {
    testing::Message::Message(&local_2438);
    pcVar12 = testing::AssertionResult::failure_message((AssertionResult *)local_2430);
    testing::internal::AssertHelper::AssertHelper
              (&local_2440,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O0/_deps/qclabpp-src/test/qgates/RotationYY.cpp"
               ,0x17f,pcVar12);
    testing::internal::AssertHelper::operator=(&local_2440,&local_2438);
    testing::internal::AssertHelper::~AssertHelper(&local_2440);
    testing::Message::~Message(&local_2438);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2430);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&gtest_ar_109.message_);
  qclab::qgates::RotationYY<std::complex<double>_>::~RotationYY
            ((RotationYY<std::complex<double>_> *)&cos_8);
  return;
}

Assistant:

void test_qclab_qgates_RotationYY() {

  using R = qclab::real_t< T > ;
  const R pi = 4 * std::atan(1) ;
  const R tol = 10 * std::numeric_limits< R >::epsilon() ;

  {
    qclab::qgates::RotationYY< T >  Ryy ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;   // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;       // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;  // controlled
    EXPECT_EQ( Ryy.cos() , 1.0 ) ;      // cos
    EXPECT_EQ( Ryy.sin() , 0.0 ) ;      // sin
    EXPECT_EQ( Ryy.theta() , 0.0 ) ;    // theta

    // matrix
    auto eye = qclab::dense::eye< T >( 4 ) ;
    EXPECT_TRUE( Ryy.matrix() == eye ) ;

    // qubits
    EXPECT_EQ( Ryy.qubits().size() , 2 ) ;
    EXPECT_EQ( Ryy.qubits()[0] , 0 ) ;
    EXPECT_EQ( Ryy.qubits()[1] , 1 ) ;
    int qnew[2] = { 3 , 5 } ;
    Ryy.setQubits( &qnew[0] ) ;
    EXPECT_EQ( Ryy.qubits().size() , 2 ) ;
    EXPECT_EQ( Ryy.qubits()[0] , 3 ) ;
    EXPECT_EQ( Ryy.qubits()[1] , 5 ) ;

    // fixed
    Ryy.makeFixed() ;
    EXPECT_TRUE( Ryy.fixed() ) ;
    Ryy.makeVariable() ;
    EXPECT_FALSE( Ryy.fixed() ) ;

    // update(rot)
    qclab::QRotation< R >  new_rot( 1 ) ;
    Ryy.update( new_rot ) ;
    EXPECT_NEAR( Ryy.theta() , 1 , tol ) ;
    EXPECT_NEAR( Ryy.cos() , std::cos( 0.5 ) , tol ) ;
    EXPECT_NEAR( Ryy.sin() , std::sin( 0.5 ) , tol ) ;

    // update(theta)
    Ryy.update( pi/2 ) ;
    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;
    EXPECT_NEAR( Ryy.cos() , std::cos( pi/4 ) , tol ) ;
    EXPECT_NEAR( Ryy.sin() , std::sin( pi/4 ) , tol ) ;

    // matrix
    const R cos = std::cos( pi/4 ) ;
    const R sin = std::sin( pi/4 ) ;
    EXPECT_EQ( Ryy.matrix()(0,0) , T(cos,0.0) ) ;
    EXPECT_EQ( Ryy.matrix()(1,1) , T(cos,0.0) ) ;
    EXPECT_EQ( Ryy.matrix()(2,2) , T(cos,0.0) ) ;
    EXPECT_EQ( Ryy.matrix()(3,3) , T(cos,0.0) ) ;
    EXPECT_EQ( Ryy.matrix()(3,0) , T(0.0, sin) ) ;
    EXPECT_EQ( Ryy.matrix()(2,1) , T(0.0,-sin) ) ;
    EXPECT_EQ( Ryy.matrix()(1,2) , T(0.0,-sin) ) ;
    EXPECT_EQ( Ryy.matrix()(0,3) , T(0.0, sin) ) ;
    EXPECT_EQ( Ryy.matrix()(1,0) , T(0) ) ;
    EXPECT_EQ( Ryy.matrix()(2,0) , T(0) ) ;
    EXPECT_EQ( Ryy.matrix()(0,1) , T(0) ) ;
    EXPECT_EQ( Ryy.matrix()(3,1) , T(0) ) ;
    EXPECT_EQ( Ryy.matrix()(0,2) , T(0) ) ;
    EXPECT_EQ( Ryy.matrix()(3,2) , T(0) ) ;
    EXPECT_EQ( Ryy.matrix()(1,3) , T(0) ) ;
    EXPECT_EQ( Ryy.matrix()(2,3) , T(0) ) ;

    // print
    Ryy.print() ;

    // toQASM
    std::stringstream qasm ;
    EXPECT_EQ( Ryy.toQASM( qasm ) , 0 ) ;
    auto str_theta = qclab::qasm( Ryy.theta() ) ;
    std::string qasm_check = "ryy(" + str_theta + ") q[3], q[5];\n" ;
    EXPECT_EQ( qasm.str() , qasm_check ) ;
    std::cout << qasm.str() ;

    // update(cos,sin)
    Ryy.update( std::cos( pi/3 ) , std::sin( pi/3 ) ) ;
    EXPECT_NEAR( Ryy.cos() , std::cos( pi/3 ) , tol ) ;
    EXPECT_NEAR( Ryy.sin() , std::sin( pi/3 ) , tol ) ;
    EXPECT_NEAR( Ryy.theta() , 2*(pi/3) , tol ) ;

    // operators == and !=
    qclab::qgates::RotationYY< T >  Ryy2( std::cos( pi/3 ) , std::sin( pi/3 ) );
    EXPECT_TRUE( Ryy == Ryy2 ) ;
    EXPECT_FALSE( Ryy != Ryy2 ) ;
    Ryy2.update( 1 ) ;
    EXPECT_TRUE( Ryy != Ryy2 ) ;
    EXPECT_FALSE( Ryy == Ryy2 ) ;
  }

  //
  // constructors without qubits
  //
  {
    qclab::QRotation< R >           rot( pi/2 ) ;
    qclab::qgates::RotationYY< T >  Ryy( rot ) ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;                    // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;                        // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;                   // controlled

    auto qubits = Ryy.qubits() ;
    EXPECT_EQ( qubits[0] , 0 ) ;                         // qubit0
    EXPECT_EQ( qubits[1] , 1 ) ;                         // qubit1

    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( Ryy.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( Ryy.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    qclab::qgates::RotationYY< T >  Ryy( pi/2 ) ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;                    // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;                        // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;                   // controlled

    auto qubits = Ryy.qubits() ;
    EXPECT_EQ( qubits[0] , 0 ) ;                         // qubit0
    EXPECT_EQ( qubits[1] , 1 ) ;                         // qubit1

    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( Ryy.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( Ryy.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    const R cos = std::cos( pi/4 ) ;
    const R sin = std::sin( pi/4 ) ;
    qclab::qgates::RotationYY< T >  Ryy( cos , sin ) ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;          // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;              // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;         // controlled

    auto qubits = Ryy.qubits() ;
    EXPECT_EQ( qubits[0] , 0 ) ;               // qubit0
    EXPECT_EQ( qubits[1] , 1 ) ;               // qubit1

    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;  // theta
    EXPECT_NEAR( Ryy.cos() , cos , tol ) ;     // cos
    EXPECT_NEAR( Ryy.sin() , sin , tol ) ;     // sin
  }


  //
  // constructors with *qubits
  //
  {
    int qbits[2] = { 3 , 5 } ;
    qclab::QRotation< R >           rot( pi/2 ) ;
    qclab::qgates::RotationYY< T >  Ryy( &qbits[0] , rot ) ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;                    // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;                        // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;                   // controlled

    auto qubits = Ryy.qubits() ;
    EXPECT_EQ( qubits[0] , 3 ) ;                         // qubit0
    EXPECT_EQ( qubits[1] , 5 ) ;                         // qubit1

    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( Ryy.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( Ryy.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    int qbits[2] = { 3 , 5 } ;
    qclab::qgates::RotationYY< T >  Ryy( &qbits[0] , pi/2 ) ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;                    // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;                        // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;                   // controlled

    auto qubits = Ryy.qubits() ;
    EXPECT_EQ( qubits[0] , 3 ) ;                         // qubit0
    EXPECT_EQ( qubits[1] , 5 ) ;                         // qubit1

    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( Ryy.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( Ryy.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    int qbits[2] = { 3 , 5 } ;
    const R cos = std::cos( pi/4 ) ;
    const R sin = std::sin( pi/4 ) ;
    qclab::qgates::RotationYY< T >  Ryy( &qbits[0] , cos , sin ) ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;          // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;              // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;         // controlled

    auto qubits = Ryy.qubits() ;
    EXPECT_EQ( qubits[0] , 3 ) ;               // qubit0
    EXPECT_EQ( qubits[1] , 5 ) ;               // qubit1

    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;  // theta
    EXPECT_NEAR( Ryy.cos() , cos , tol ) ;     // cos
    EXPECT_NEAR( Ryy.sin() , sin , tol ) ;     // sin
  }


  //
  // constructors with qubit0 and qubit1
  //
  {
    int qubit0 = 3 ;
    int qubit1 = 5 ;
    qclab::QRotation< R >           rot( pi/2 ) ;
    qclab::qgates::RotationYY< T >  Ryy( qubit0 , qubit1 , rot ) ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;                    // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;                        // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;                   // controlled

    auto qubits = Ryy.qubits() ;
    EXPECT_EQ( qubits[0] , 3 ) ;                         // qubit0
    EXPECT_EQ( qubits[1] , 5 ) ;                         // qubit1

    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( Ryy.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( Ryy.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    int qubit0 = 3 ;
    int qubit1 = 5 ;
    qclab::qgates::RotationYY< T >  Ryy( qubit0 , qubit1 , pi/2 ) ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;                    // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;                        // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;                   // controlled

    auto qubits = Ryy.qubits() ;
    EXPECT_EQ( qubits[0] , 3 ) ;                         // qubit0
    EXPECT_EQ( qubits[1] , 5 ) ;                         // qubit1

    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;            // theta
    EXPECT_NEAR( Ryy.cos() , std::cos( pi/4 ) , tol ) ;  // cos
    EXPECT_NEAR( Ryy.sin() , std::sin( pi/4 ) , tol ) ;  // sin
  }

  {
    int qubit0 = 3 ;
    int qubit1 = 5 ;
    const R cos = std::cos( pi/4 ) ;
    const R sin = std::sin( pi/4 ) ;
    qclab::qgates::RotationYY< T >  Ryy( qubit0 , qubit1 , cos , sin ) ;

    EXPECT_EQ( Ryy.nbQubits() , 2 ) ;          // nbQubits
    EXPECT_FALSE( Ryy.fixed() ) ;              // fixed
    EXPECT_FALSE( Ryy.controlled() ) ;         // controlled

    auto qubits = Ryy.qubits() ;
    EXPECT_EQ( qubits[0] , 3 ) ;               // qubit0
    EXPECT_EQ( qubits[1] , 5 ) ;               // qubit1

    EXPECT_NEAR( Ryy.theta() , pi/2 , tol ) ;  // theta
    EXPECT_NEAR( Ryy.cos() , cos , tol ) ;     // cos
    EXPECT_NEAR( Ryy.sin() , sin , tol ) ;     // sin
  }

  {
    const R theta1 = pi/2 ;
    const qclab::QAngle< R >        angle1( theta1 ) ;
    const qclab::QRotation< R >     rot1( angle1 ) ;
    qclab::qgates::RotationYY< T >  R1( 0 , 1 , rot1 ) ;

    const R theta2 = pi/3 ;
    const qclab::QAngle< R >        angle2( theta2 ) ;
    const qclab::QRotation< R >     rot2( angle2 ) ;
    qclab::qgates::RotationYY< T >  R2( 0 , 1 , rot2 ) ;

    // operator *=
    R1 *= R2 ;
    qclab::QAngle< R >  angle = angle1 + angle2 ;
    R cos   = angle.cos() ;
    R sin   = angle.sin() ;
    R theta = angle.theta() ;
    EXPECT_NEAR( R1.cos() , cos , tol ) ;                 // cos
    EXPECT_NEAR( R1.sin() , sin , tol ) ;                 // sin
    EXPECT_NEAR( R1.theta() , 2*theta , tol ) ;           // theta
    EXPECT_NEAR( R2.cos() , std::cos( theta2 ) , tol ) ;  // cos
    EXPECT_NEAR( R2.sin() , std::sin( theta2 ) , tol ) ;  // sin
    EXPECT_NEAR( R2.theta() , 2*theta2 , tol ) ;          // theta
  }

  {
    const R theta1 = pi/2 ;
    const qclab::QAngle< R >        angle1( theta1 ) ;
    const qclab::QRotation< R >     rot1( angle1 ) ;
    qclab::qgates::RotationYY< T >  R1( 0 , 1 , rot1 ) ;

    const R theta2 = pi/3 ;
    const qclab::QAngle< R >        angle2( theta2 ) ;
    const qclab::QRotation< R >     rot2( angle2 ) ;
    qclab::qgates::RotationYY< T >  R2( 0 , 1 , rot2 ) ;

    // operator /=
    R1 /= R2 ;
    qclab::QAngle< R >  angle = angle1 - angle2 ;
    R cos   = angle.cos() ;
    R sin   = angle.sin() ;
    R theta = angle.theta() ;
    EXPECT_NEAR( R1.cos() , cos , tol ) ;                 // cos
    EXPECT_NEAR( R1.sin() , sin , tol ) ;                 // sin
    EXPECT_NEAR( R1.theta() , 2*theta , tol ) ;           // theta
    EXPECT_NEAR( R2.cos() , std::cos( theta2 ) , tol ) ;  // cos
    EXPECT_NEAR( R2.sin() , std::sin( theta2 ) , tol ) ;  // sin
    EXPECT_NEAR( R2.theta() , 2*theta2 , tol ) ;          // theta
  }

  {
    const R theta1 = pi/2 ;
    const qclab::QAngle< R >        angle1( theta1 ) ;
    const qclab::QRotation< R >     rot1( angle1 ) ;
    qclab::qgates::RotationYY< T >  R1( 0 , 1 , rot1 ) ;

    const R theta2 = pi/3 ;
    const qclab::QAngle< R >        angle2( theta2 ) ;
    const qclab::QRotation< R >     rot2( angle2 ) ;
    qclab::qgates::RotationYY< T >  R2( 0 , 1 , rot2 ) ;

    // operator *
    qclab::qgates::RotationYY< T > R12 = R1 * R2 ;
    qclab::QAngle< R >  angle = angle1 + angle2 ;
    R cos   = angle.cos() ;
    R sin   = angle.sin() ;
    R theta = angle.theta() ;
    EXPECT_NEAR( R12.cos() , cos , tol ) ;        // cos
    EXPECT_NEAR( R12.sin() , sin , tol ) ;        // sin
    EXPECT_NEAR( R12.theta() , 2*theta , tol ) ;  // theta
  }

  {
    const R theta1 = pi/2 ;
    const qclab::QAngle< R >        angle1( theta1 ) ;
    const qclab::QRotation< R >     rot1( angle1 ) ;
    qclab::qgates::RotationYY< T >  R1( 0 , 1 , rot1 ) ;

    const R theta2 = pi/3 ;
    const qclab::QAngle< R >        angle2( theta2 ) ;
    const qclab::QRotation< R >     rot2( angle2 ) ;
    qclab::qgates::RotationYY< T >  R2( 0 , 1 , rot2 ) ;

    // operator /
    qclab::qgates::RotationYY< T > R12 = R1 / R2 ;
    qclab::QAngle< R >  angle = angle1 - angle2 ;
    R cos   = angle.cos() ;
    R sin   = angle.sin() ;
    R theta = angle.theta() ;
    EXPECT_NEAR( R12.cos() , cos , tol ) ;        // cos
    EXPECT_NEAR( R12.sin() , sin , tol ) ;        // sin
    EXPECT_NEAR( R12.theta() , 2*theta , tol ) ;  // theta
  }

  {
    const R theta1 = pi/2 ;
    const qclab::QAngle< R >        angle1( theta1 ) ;
    const qclab::QRotation< R >     rot1( angle1 ) ;
    qclab::qgates::RotationYY< T >  R1( 0 , 1 , rot1 ) ;
    R cos   = R1.cos() ;
    R sin   = R1.sin() ;
    R theta = R1.theta() ;

    // inv
    qclab::qgates::RotationYY< T >  R2 = R1.inv() ;
    EXPECT_NEAR( R1.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( R2.cos() ,  cos , tol ) ;      // cos
    EXPECT_NEAR( R1.sin() ,  sin , tol ) ;      // sin
    EXPECT_NEAR( R2.sin() , -sin , tol ) ;      // sin
    EXPECT_NEAR( R1.theta() ,  theta , tol ) ;  // theta
    EXPECT_NEAR( R2.theta() , -theta , tol ) ;  // theta
  }

}